

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  byte bVar53;
  byte bVar54;
  byte bVar55;
  ulong uVar56;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong uVar57;
  byte bVar58;
  ulong uVar59;
  byte bVar60;
  ulong uVar61;
  ulong uVar62;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined8 in_R11;
  byte bVar63;
  int iVar64;
  byte bVar65;
  bool bVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar136;
  uint uVar137;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  uint uVar138;
  uint uVar142;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar134 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar135 [64];
  float pp;
  float fVar143;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar164;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar179 [16];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar223 [32];
  undefined1 auVar227 [16];
  undefined1 auVar264 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 in_ZMM4 [64];
  float fVar233;
  undefined1 auVar234 [16];
  float fVar238;
  undefined1 auVar236 [32];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar239 [32];
  undefined1 auVar242 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [64];
  float fVar244;
  float fVar251;
  undefined1 auVar247 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar249;
  float fVar250;
  undefined1 auVar248 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  float fVar256;
  undefined1 auVar255 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  float fVar263;
  undefined1 auVar265 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar153 [32];
  
  uVar56 = (ulong)(byte)prim[1];
  fVar244 = *(float *)(prim + uVar56 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar74 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar75 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar56 * 0x19 + 6));
  fVar210 = fVar244 * auVar75._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar56 * 4 + 6);
  auVar85 = vpmovsxbd_avx2(auVar12);
  fVar143 = fVar244 * auVar74._0_4_;
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar56 * 5 + 6);
  auVar83 = vpmovsxbd_avx2(auVar13);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar56 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar56 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar72);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar56 * 0xc + 6);
  auVar88 = vpmovsxbd_avx2(auVar69);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar56 * 0xd + 6);
  auVar84 = vpmovsxbd_avx2(auVar1);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar56 * 0x12 + 6);
  auVar89 = vpmovsxbd_avx2(auVar73);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar56 * 0x13 + 6);
  auVar90 = vpmovsxbd_avx2(auVar70);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar56 * 0x14 + 6);
  auVar92 = vpmovsxbd_avx2(auVar227);
  auVar91 = vcvtdq2ps_avx(auVar92);
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  auVar101._4_4_ = fVar143;
  auVar101._0_4_ = fVar143;
  auVar101._8_4_ = fVar143;
  auVar101._12_4_ = fVar143;
  auVar101._16_4_ = fVar143;
  auVar101._20_4_ = fVar143;
  auVar101._24_4_ = fVar143;
  auVar101._28_4_ = fVar143;
  auVar82 = ZEXT1632(CONCAT412(fVar244 * auVar74._12_4_,
                               CONCAT48(fVar244 * auVar74._8_4_,
                                        CONCAT44(fVar244 * auVar74._4_4_,fVar143))));
  auVar93 = vpermps_avx2(auVar103,auVar82);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar81 = vpermps_avx512vl(auVar80,auVar82);
  fVar143 = auVar81._0_4_;
  auVar161._0_4_ = fVar143 * auVar86._0_4_;
  fVar249 = auVar81._4_4_;
  auVar161._4_4_ = fVar249 * auVar86._4_4_;
  fVar250 = auVar81._8_4_;
  auVar161._8_4_ = fVar250 * auVar86._8_4_;
  fVar251 = auVar81._12_4_;
  auVar161._12_4_ = fVar251 * auVar86._12_4_;
  fVar224 = auVar81._16_4_;
  auVar161._16_4_ = fVar224 * auVar86._16_4_;
  fVar225 = auVar81._20_4_;
  auVar161._20_4_ = fVar225 * auVar86._20_4_;
  fVar226 = auVar81._24_4_;
  auVar161._28_36_ = in_ZMM4._28_36_;
  auVar161._24_4_ = fVar226 * auVar86._24_4_;
  auVar82._4_4_ = auVar84._4_4_ * fVar249;
  auVar82._0_4_ = auVar84._0_4_ * fVar143;
  auVar82._8_4_ = auVar84._8_4_ * fVar250;
  auVar82._12_4_ = auVar84._12_4_ * fVar251;
  auVar82._16_4_ = auVar84._16_4_ * fVar224;
  auVar82._20_4_ = auVar84._20_4_ * fVar225;
  auVar82._24_4_ = auVar84._24_4_ * fVar226;
  auVar82._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = fVar249 * auVar91._4_4_;
  auVar92._0_4_ = fVar143 * auVar91._0_4_;
  auVar92._8_4_ = fVar250 * auVar91._8_4_;
  auVar92._12_4_ = fVar251 * auVar91._12_4_;
  auVar92._16_4_ = fVar224 * auVar91._16_4_;
  auVar92._20_4_ = fVar225 * auVar91._20_4_;
  auVar92._24_4_ = fVar226 * auVar91._24_4_;
  auVar92._28_4_ = auVar81._28_4_;
  auVar12 = vfmadd231ps_fma(auVar161._0_32_,auVar93,auVar83);
  auVar13 = vfmadd231ps_fma(auVar82,auVar93,auVar88);
  auVar71 = vfmadd231ps_fma(auVar92,auVar90,auVar93);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar101,auVar85);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar101,auVar87);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar89,auVar101);
  auVar102._4_4_ = fVar210;
  auVar102._0_4_ = fVar210;
  auVar102._8_4_ = fVar210;
  auVar102._12_4_ = fVar210;
  auVar102._16_4_ = fVar210;
  auVar102._20_4_ = fVar210;
  auVar102._24_4_ = fVar210;
  auVar102._28_4_ = fVar210;
  auVar93 = ZEXT1632(CONCAT412(fVar244 * auVar75._12_4_,
                               CONCAT48(fVar244 * auVar75._8_4_,
                                        CONCAT44(fVar244 * auVar75._4_4_,fVar210))));
  auVar92 = vpermps_avx2(auVar103,auVar93);
  auVar82 = vpermps_avx512vl(auVar80,auVar93);
  fVar244 = auVar82._0_4_;
  fVar143 = auVar82._4_4_;
  auVar93._4_4_ = fVar143 * auVar86._4_4_;
  auVar93._0_4_ = fVar244 * auVar86._0_4_;
  fVar249 = auVar82._8_4_;
  auVar93._8_4_ = fVar249 * auVar86._8_4_;
  fVar250 = auVar82._12_4_;
  auVar93._12_4_ = fVar250 * auVar86._12_4_;
  fVar251 = auVar82._16_4_;
  auVar93._16_4_ = fVar251 * auVar86._16_4_;
  fVar224 = auVar82._20_4_;
  auVar93._20_4_ = fVar224 * auVar86._20_4_;
  fVar225 = auVar82._24_4_;
  auVar93._24_4_ = fVar225 * auVar86._24_4_;
  auVar93._28_4_ = auVar86._28_4_;
  auVar97._0_4_ = fVar244 * auVar84._0_4_;
  auVar97._4_4_ = fVar143 * auVar84._4_4_;
  auVar97._8_4_ = fVar249 * auVar84._8_4_;
  auVar97._12_4_ = fVar250 * auVar84._12_4_;
  auVar97._16_4_ = fVar251 * auVar84._16_4_;
  auVar97._20_4_ = fVar224 * auVar84._20_4_;
  auVar97._24_4_ = fVar225 * auVar84._24_4_;
  auVar97._28_4_ = 0;
  auVar84._4_4_ = fVar143 * auVar91._4_4_;
  auVar84._0_4_ = fVar244 * auVar91._0_4_;
  auVar84._8_4_ = fVar249 * auVar91._8_4_;
  auVar84._12_4_ = fVar250 * auVar91._12_4_;
  auVar84._16_4_ = fVar251 * auVar91._16_4_;
  auVar84._20_4_ = fVar224 * auVar91._20_4_;
  auVar84._24_4_ = fVar225 * auVar91._24_4_;
  auVar84._28_4_ = auVar91._28_4_;
  auVar72 = vfmadd231ps_fma(auVar93,auVar92,auVar83);
  auVar69 = vfmadd231ps_fma(auVar97,auVar92,auVar88);
  auVar1 = vfmadd231ps_fma(auVar84,auVar92,auVar90);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar102,auVar85);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar102,auVar87);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar102,auVar89);
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar100._16_4_ = 0x219392ef;
  auVar100._20_4_ = 0x219392ef;
  auVar100._24_4_ = 0x219392ef;
  auVar100._28_4_ = 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar12),auVar98);
  uVar62 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar66 = (bool)((byte)uVar62 & 1);
  auVar80._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._0_4_;
  bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._4_4_;
  bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._8_4_;
  bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar62 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar13),auVar98);
  uVar62 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar66 = (bool)((byte)uVar62 & 1);
  auVar81._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._0_4_;
  bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._4_4_;
  bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._8_4_;
  bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar62 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar71),auVar98);
  uVar62 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar66 = (bool)((byte)uVar62 & 1);
  auVar85._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._0_4_;
  bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._4_4_;
  bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._8_4_;
  bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar62 >> 7) * 0x219392ef;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar99._16_4_ = 0x3f800000;
  auVar99._20_4_ = 0x3f800000;
  auVar99._24_4_ = 0x3f800000;
  auVar99._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar80,auVar83,auVar99);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar13 = vfnmadd213ps_fma(auVar81,auVar83,auVar99);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar85);
  auVar71 = vfnmadd213ps_fma(auVar85,auVar83,auVar99);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar83,auVar83);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 7 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar72));
  auVar89._4_4_ = auVar12._4_4_ * auVar85._4_4_;
  auVar89._0_4_ = auVar12._0_4_ * auVar85._0_4_;
  auVar89._8_4_ = auVar12._8_4_ * auVar85._8_4_;
  auVar89._12_4_ = auVar12._12_4_ * auVar85._12_4_;
  auVar89._16_4_ = auVar85._16_4_ * 0.0;
  auVar89._20_4_ = auVar85._20_4_ * 0.0;
  auVar89._24_4_ = auVar85._24_4_ * 0.0;
  auVar89._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 9 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar72));
  auVar94._0_4_ = auVar12._0_4_ * auVar85._0_4_;
  auVar94._4_4_ = auVar12._4_4_ * auVar85._4_4_;
  auVar94._8_4_ = auVar12._8_4_ * auVar85._8_4_;
  auVar94._12_4_ = auVar12._12_4_ * auVar85._12_4_;
  auVar94._16_4_ = auVar85._16_4_ * 0.0;
  auVar94._20_4_ = auVar85._20_4_ * 0.0;
  auVar94._24_4_ = auVar85._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0xe + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar69));
  auVar90._4_4_ = auVar13._4_4_ * auVar85._4_4_;
  auVar90._0_4_ = auVar13._0_4_ * auVar85._0_4_;
  auVar90._8_4_ = auVar13._8_4_ * auVar85._8_4_;
  auVar90._12_4_ = auVar13._12_4_ * auVar85._12_4_;
  auVar90._16_4_ = auVar85._16_4_ * 0.0;
  auVar90._20_4_ = auVar85._20_4_ * 0.0;
  auVar90._24_4_ = auVar85._24_4_ * 0.0;
  auVar90._28_4_ = auVar85._28_4_;
  auVar84 = vpbroadcastd_avx512vl();
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar69));
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x15 + 6));
  auVar96._0_4_ = auVar13._0_4_ * auVar85._0_4_;
  auVar96._4_4_ = auVar13._4_4_ * auVar85._4_4_;
  auVar96._8_4_ = auVar13._8_4_ * auVar85._8_4_;
  auVar96._12_4_ = auVar13._12_4_ * auVar85._12_4_;
  auVar96._16_4_ = auVar85._16_4_ * 0.0;
  auVar96._20_4_ = auVar85._20_4_ * 0.0;
  auVar96._24_4_ = auVar85._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar85 = vcvtdq2ps_avx(auVar83);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar1));
  auVar91._4_4_ = auVar85._4_4_ * auVar71._4_4_;
  auVar91._0_4_ = auVar85._0_4_ * auVar71._0_4_;
  auVar91._8_4_ = auVar85._8_4_ * auVar71._8_4_;
  auVar91._12_4_ = auVar85._12_4_ * auVar71._12_4_;
  auVar91._16_4_ = auVar85._16_4_ * 0.0;
  auVar91._20_4_ = auVar85._20_4_ * 0.0;
  auVar91._24_4_ = auVar85._24_4_ * 0.0;
  auVar91._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x17 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar1));
  auVar95._0_4_ = auVar71._0_4_ * auVar85._0_4_;
  auVar95._4_4_ = auVar71._4_4_ * auVar85._4_4_;
  auVar95._8_4_ = auVar71._8_4_ * auVar85._8_4_;
  auVar95._12_4_ = auVar71._12_4_ * auVar85._12_4_;
  auVar95._16_4_ = auVar85._16_4_ * 0.0;
  auVar95._20_4_ = auVar85._20_4_ * 0.0;
  auVar95._24_4_ = auVar85._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar85 = vpminsd_avx2(auVar89,auVar94);
  auVar83 = vpminsd_avx2(auVar90,auVar96);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83 = vpminsd_avx2(auVar91,auVar95);
  uVar168 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar86._4_4_ = uVar168;
  auVar86._0_4_ = uVar168;
  auVar86._8_4_ = uVar168;
  auVar86._12_4_ = uVar168;
  auVar86._16_4_ = uVar168;
  auVar86._20_4_ = uVar168;
  auVar86._24_4_ = uVar168;
  auVar86._28_4_ = uVar168;
  auVar83 = vmaxps_avx512vl(auVar83,auVar86);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  auVar83._16_4_ = 0x3f7ffffa;
  auVar83._20_4_ = 0x3f7ffffa;
  auVar83._24_4_ = 0x3f7ffffa;
  auVar83._28_4_ = 0x3f7ffffa;
  local_640 = vmulps_avx512vl(auVar85,auVar83);
  auVar85 = vpmaxsd_avx2(auVar89,auVar94);
  auVar83 = vpmaxsd_avx2(auVar90,auVar96);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar83 = vpmaxsd_avx2(auVar91,auVar95);
  uVar168 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar87._4_4_ = uVar168;
  auVar87._0_4_ = uVar168;
  auVar87._8_4_ = uVar168;
  auVar87._12_4_ = uVar168;
  auVar87._16_4_ = uVar168;
  auVar87._20_4_ = uVar168;
  auVar87._24_4_ = uVar168;
  auVar87._28_4_ = uVar168;
  auVar83 = vminps_avx512vl(auVar83,auVar87);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar88);
  uVar15 = vcmpps_avx512vl(local_640,auVar85,2);
  uVar17 = vpcmpgtd_avx512vl(auVar84,_DAT_01fb4ba0);
  uVar62 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar17));
  auVar161 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar161);
LAB_019e1954:
  iVar64 = 1;
  if (uVar62 == 0) {
LAB_019e43a1:
    return uVar62 != 0;
  }
  iVar18 = 0;
  for (uVar57 = uVar62; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    iVar18 = iVar18 + 1;
  }
  uVar61 = uVar62 - 1 & uVar62;
  uVar57 = (ulong)(uint)(iVar18 << 6);
  auVar12 = *(undefined1 (*) [16])(prim + uVar57 + uVar56 * 0x19 + 0x16);
  if (uVar61 != 0) {
    uVar59 = uVar61 - 1 & uVar61;
    for (uVar67 = uVar61; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    }
    if (uVar59 != 0) {
      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar13 = *(undefined1 (*) [16])(prim + uVar57 + uVar56 * 0x19 + 0x26);
  auVar71 = *(undefined1 (*) [16])(prim + uVar57 + uVar56 * 0x19 + 0x36);
  auVar72 = *(undefined1 (*) [16])(prim + uVar57 + uVar56 * 0x19 + 0x46);
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar168 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar77._4_4_ = uVar168;
  auVar77._0_4_ = uVar168;
  auVar77._8_4_ = uVar168;
  auVar77._12_4_ = uVar168;
  local_800._16_4_ = uVar168;
  local_800._0_16_ = auVar77;
  local_800._20_4_ = uVar168;
  local_800._24_4_ = uVar168;
  local_800._28_4_ = uVar168;
  auVar262 = ZEXT3264(local_800);
  uVar168 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar79._4_4_ = uVar168;
  auVar79._0_4_ = uVar168;
  auVar79._8_4_ = uVar168;
  auVar79._12_4_ = uVar168;
  local_820._16_4_ = uVar168;
  local_820._0_16_ = auVar79;
  local_820._20_4_ = uVar168;
  local_820._24_4_ = uVar168;
  local_820._28_4_ = uVar168;
  auVar69 = vunpcklps_avx(auVar77,auVar79);
  fVar244 = *(float *)(ray + k * 4 + 0x180);
  auVar252._4_4_ = fVar244;
  auVar252._0_4_ = fVar244;
  auVar252._8_4_ = fVar244;
  auVar252._12_4_ = fVar244;
  local_840._16_4_ = fVar244;
  local_840._0_16_ = auVar252;
  local_840._20_4_ = fVar244;
  local_840._24_4_ = fVar244;
  local_840._28_4_ = fVar244;
  local_9d0 = vinsertps_avx(auVar69,auVar252,0x28);
  auVar253 = ZEXT1664(local_9d0);
  auVar75._0_4_ = auVar12._0_4_ + auVar13._0_4_ + auVar71._0_4_ + auVar72._0_4_;
  auVar75._4_4_ = auVar12._4_4_ + auVar13._4_4_ + auVar71._4_4_ + auVar72._4_4_;
  auVar75._8_4_ = auVar12._8_4_ + auVar13._8_4_ + auVar71._8_4_ + auVar72._8_4_;
  auVar75._12_4_ = auVar12._12_4_ + auVar13._12_4_ + auVar71._12_4_ + auVar72._12_4_;
  auVar74._8_4_ = 0x3e800000;
  auVar74._0_8_ = 0x3e8000003e800000;
  auVar74._12_4_ = 0x3e800000;
  auVar69 = vmulps_avx512vl(auVar75,auVar74);
  auVar69 = vsubps_avx(auVar69,auVar1);
  auVar69 = vdpps_avx(auVar69,local_9d0,0x7f);
  fVar143 = *(float *)(ray + k * 4 + 0xc0);
  auVar255 = ZEXT464((uint)fVar143);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar257 = ZEXT1664(local_9e0);
  uVar2 = *(uint *)(prim + 2);
  auVar76._4_12_ = ZEXT812(0) << 0x20;
  auVar76._0_4_ = local_9e0._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar76);
  auVar73 = vfnmadd213ss_fma(auVar70,local_9e0,ZEXT416(0x40000000));
  local_620 = auVar69._0_4_ * auVar70._0_4_ * auVar73._0_4_;
  auVar78._4_4_ = local_620;
  auVar78._0_4_ = local_620;
  auVar78._8_4_ = local_620;
  auVar78._12_4_ = local_620;
  fStack_7d0 = local_620;
  _local_7e0 = auVar78;
  fStack_7cc = local_620;
  fStack_7c8 = local_620;
  fStack_7c4 = local_620;
  auVar69 = vfmadd231ps_fma(auVar1,local_9d0,auVar78);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar12 = vsubps_avx(auVar12,auVar69);
  auVar71 = vsubps_avx(auVar71,auVar69);
  auVar243 = ZEXT1664(auVar71);
  auVar13 = vsubps_avx(auVar13,auVar69);
  auVar248 = ZEXT1664(auVar13);
  auVar72 = vsubps_avx(auVar72,auVar69);
  auVar85 = vbroadcastss_avx512vl(auVar12);
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  local_960 = ZEXT1632(auVar12);
  auVar83 = vpermps_avx512vl(auVar105,local_960);
  auVar106._8_4_ = 2;
  auVar106._0_8_ = 0x200000002;
  auVar106._12_4_ = 2;
  auVar106._16_4_ = 2;
  auVar106._20_4_ = 2;
  auVar106._24_4_ = 2;
  auVar106._28_4_ = 2;
  auVar86 = vpermps_avx512vl(auVar106,local_960);
  auVar107._8_4_ = 3;
  auVar107._0_8_ = 0x300000003;
  auVar107._12_4_ = 3;
  auVar107._16_4_ = 3;
  auVar107._20_4_ = 3;
  auVar107._24_4_ = 3;
  auVar107._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar107,local_960);
  auVar88 = vbroadcastss_avx512vl(auVar13);
  local_9a0 = ZEXT1632(auVar13);
  auVar84 = vpermps_avx512vl(auVar105,local_9a0);
  auVar89 = vpermps_avx512vl(auVar106,local_9a0);
  auVar90 = vpermps_avx512vl(auVar107,local_9a0);
  auVar91 = vbroadcastss_avx512vl(auVar71);
  local_980 = ZEXT1632(auVar71);
  auVar92 = vpermps_avx512vl(auVar105,local_980);
  auVar93 = vpermps_avx512vl(auVar106,local_980);
  auVar82 = vpermps_avx512vl(auVar107,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar72);
  _local_9c0 = ZEXT1632(auVar72);
  local_5c0 = vpermps_avx2(auVar105,_local_9c0);
  local_580 = vpermps_avx512vl(auVar106,_local_9c0);
  local_600 = vpermps_avx2(auVar107,_local_9c0);
  auVar12 = vfmadd231ps_fma(ZEXT432((uint)(fVar244 * fVar244)),local_820,local_820);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_800,local_800);
  local_560._0_4_ = auVar12._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar104);
  local_940 = ZEXT416((uint)local_620);
  local_620 = fVar143 - local_620;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar161 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar161);
  uVar57 = 0;
  bVar65 = 0;
  auVar161 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar161);
  auVar12 = vsqrtss_avx(local_9e0,local_9e0);
  auVar13 = vsqrtss_avx(local_9e0,local_9e0);
  local_6d0 = ZEXT816(0x3f80000000000000);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar265 = ZEXT3264(auVar80);
  auVar161 = ZEXT3264(_DAT_01f7b040);
  local_5e0 = local_580;
  do {
    auVar71 = vmovshdup_avx(local_6d0);
    auVar71 = vsubps_avx(auVar71,local_6d0);
    auVar145._0_4_ = auVar71._0_4_;
    fVar14 = auVar145._0_4_ * 0.04761905;
    uVar168 = local_6d0._0_4_;
    auVar230._4_4_ = uVar168;
    auVar230._0_4_ = uVar168;
    auVar230._8_4_ = uVar168;
    auVar230._12_4_ = uVar168;
    auVar230._16_4_ = uVar168;
    auVar230._20_4_ = uVar168;
    auVar230._24_4_ = uVar168;
    auVar230._28_4_ = uVar168;
    auVar145._4_4_ = auVar145._0_4_;
    auVar145._8_4_ = auVar145._0_4_;
    auVar145._12_4_ = auVar145._0_4_;
    auVar153._16_4_ = auVar145._0_4_;
    auVar153._0_16_ = auVar145;
    auVar153._20_4_ = auVar145._0_4_;
    auVar153._24_4_ = auVar145._0_4_;
    auVar153._28_4_ = auVar145._0_4_;
    auVar71 = vfmadd231ps_fma(auVar230,auVar153,auVar161._0_32_);
    auVar264 = auVar265._0_32_;
    auVar81 = vsubps_avx512vl(auVar264,ZEXT1632(auVar71));
    fVar244 = auVar81._0_4_;
    fVar250 = auVar81._4_4_;
    fVar224 = auVar81._8_4_;
    fVar226 = auVar81._12_4_;
    fVar233 = auVar81._16_4_;
    fVar263 = auVar81._20_4_;
    fVar185 = auVar81._24_4_;
    fVar144 = fVar244 * fVar244 * fVar244;
    fVar162 = fVar250 * fVar250 * fVar250;
    auVar112._4_4_ = fVar162;
    auVar112._0_4_ = fVar144;
    fVar163 = fVar224 * fVar224 * fVar224;
    auVar112._8_4_ = fVar163;
    fVar164 = fVar226 * fVar226 * fVar226;
    auVar112._12_4_ = fVar164;
    fVar165 = fVar233 * fVar233 * fVar233;
    auVar112._16_4_ = fVar165;
    fVar166 = fVar263 * fVar263 * fVar263;
    auVar112._20_4_ = fVar166;
    fVar167 = fVar185 * fVar185 * fVar185;
    auVar112._24_4_ = fVar167;
    auVar112._28_4_ = auVar145._0_4_;
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar80 = vmulps_avx512vl(auVar112,auVar94);
    fVar249 = auVar71._0_4_;
    fVar251 = auVar71._4_4_;
    fVar225 = auVar71._8_4_;
    fVar210 = auVar71._12_4_;
    fVar184 = fVar249 * fVar249 * fVar249;
    fVar207 = fVar251 * fVar251 * fVar251;
    fVar208 = fVar225 * fVar225 * fVar225;
    fVar209 = fVar210 * fVar210 * fVar210;
    auVar254._0_4_ = fVar249 * fVar244;
    auVar254._4_4_ = fVar251 * fVar250;
    auVar254._8_4_ = fVar225 * fVar224;
    auVar254._12_4_ = fVar210 * fVar226;
    auVar254._16_4_ = fVar233 * 0.0;
    auVar254._20_4_ = fVar263 * 0.0;
    auVar254._28_36_ = auVar253._28_36_;
    auVar254._24_4_ = fVar185 * 0.0;
    auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar209,CONCAT48(fVar208,CONCAT44(fVar207,fVar184))
                                                )),auVar94);
    fVar256 = auVar95._28_4_ + auVar145._0_4_;
    fVar238 = fVar256 + auVar257._28_4_ + auVar161._28_4_;
    auVar113._4_4_ = fVar162 * 0.16666667;
    auVar113._0_4_ = fVar144 * 0.16666667;
    auVar113._8_4_ = fVar163 * 0.16666667;
    auVar113._12_4_ = fVar164 * 0.16666667;
    auVar113._16_4_ = fVar165 * 0.16666667;
    auVar113._20_4_ = fVar166 * 0.16666667;
    auVar113._24_4_ = fVar167 * 0.16666667;
    auVar113._28_4_ = fVar256;
    auVar114._4_4_ =
         (auVar254._4_4_ * fVar250 * 12.0 + auVar254._4_4_ * fVar251 * 6.0 + fVar207 + auVar80._4_4_
         ) * 0.16666667;
    auVar114._0_4_ =
         (auVar254._0_4_ * fVar244 * 12.0 + auVar254._0_4_ * fVar249 * 6.0 + fVar184 + auVar80._0_4_
         ) * 0.16666667;
    auVar114._8_4_ =
         (auVar254._8_4_ * fVar224 * 12.0 + auVar254._8_4_ * fVar225 * 6.0 + fVar208 + auVar80._8_4_
         ) * 0.16666667;
    auVar114._12_4_ =
         (auVar254._12_4_ * fVar226 * 12.0 + auVar254._12_4_ * fVar210 * 6.0 +
         fVar209 + auVar80._12_4_) * 0.16666667;
    auVar114._16_4_ =
         (auVar254._16_4_ * fVar233 * 12.0 + auVar254._16_4_ * 0.0 * 6.0 + auVar80._16_4_ + 0.0) *
         0.16666667;
    auVar114._20_4_ =
         (auVar254._20_4_ * fVar263 * 12.0 + auVar254._20_4_ * 0.0 * 6.0 + auVar80._20_4_ + 0.0) *
         0.16666667;
    auVar114._24_4_ =
         (auVar254._24_4_ * fVar185 * 12.0 + auVar254._24_4_ * 0.0 * 6.0 + auVar80._24_4_ + 0.0) *
         0.16666667;
    auVar114._28_4_ = auVar257._28_4_;
    auVar115._4_4_ =
         (auVar95._4_4_ + fVar162 + auVar254._4_4_ * fVar251 * 12.0 + auVar254._4_4_ * fVar250 * 6.0
         ) * 0.16666667;
    auVar115._0_4_ =
         (auVar95._0_4_ + fVar144 + auVar254._0_4_ * fVar249 * 12.0 + auVar254._0_4_ * fVar244 * 6.0
         ) * 0.16666667;
    auVar115._8_4_ =
         (auVar95._8_4_ + fVar163 + auVar254._8_4_ * fVar225 * 12.0 + auVar254._8_4_ * fVar224 * 6.0
         ) * 0.16666667;
    auVar115._12_4_ =
         (auVar95._12_4_ + fVar164 +
         auVar254._12_4_ * fVar210 * 12.0 + auVar254._12_4_ * fVar226 * 6.0) * 0.16666667;
    auVar115._16_4_ =
         (auVar95._16_4_ + fVar165 + auVar254._16_4_ * 0.0 * 12.0 + auVar254._16_4_ * fVar233 * 6.0)
         * 0.16666667;
    auVar115._20_4_ =
         (auVar95._20_4_ + fVar166 + auVar254._20_4_ * 0.0 * 12.0 + auVar254._20_4_ * fVar263 * 6.0)
         * 0.16666667;
    auVar115._24_4_ =
         (auVar95._24_4_ + fVar167 + auVar254._24_4_ * 0.0 * 12.0 + auVar254._24_4_ * fVar185 * 6.0)
         * 0.16666667;
    auVar115._28_4_ = auVar262._28_4_;
    fVar184 = fVar184 * 0.16666667;
    fVar207 = fVar207 * 0.16666667;
    fVar208 = fVar208 * 0.16666667;
    fVar209 = fVar209 * 0.16666667;
    auVar116._28_4_ = fVar238;
    auVar116._0_28_ = ZEXT1628(CONCAT412(fVar209,CONCAT48(fVar208,CONCAT44(fVar207,fVar184))));
    auVar95 = vmulps_avx512vl(local_5a0,auVar116);
    auVar117._4_4_ = local_5c0._4_4_ * fVar207;
    auVar117._0_4_ = local_5c0._0_4_ * fVar184;
    auVar117._8_4_ = local_5c0._8_4_ * fVar208;
    auVar117._12_4_ = local_5c0._12_4_ * fVar209;
    auVar117._16_4_ = local_5c0._16_4_ * 0.0;
    auVar117._20_4_ = local_5c0._20_4_ * 0.0;
    auVar117._24_4_ = local_5c0._24_4_ * 0.0;
    auVar117._28_4_ = auVar255._28_4_ + auVar262._28_4_ + auVar80._28_4_ + 0.0;
    auVar80 = vmulps_avx512vl(local_5e0,auVar116);
    auVar118._4_4_ = local_600._4_4_ * fVar207;
    auVar118._0_4_ = local_600._0_4_ * fVar184;
    auVar118._8_4_ = local_600._8_4_ * fVar208;
    auVar118._12_4_ = local_600._12_4_ * fVar209;
    auVar118._16_4_ = local_600._16_4_ * 0.0;
    auVar118._20_4_ = local_600._20_4_ * 0.0;
    auVar118._24_4_ = local_600._24_4_ * 0.0;
    auVar118._28_4_ = fVar238;
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar115,auVar91);
    auVar96 = vfmadd231ps_avx512vl(auVar117,auVar115,auVar92);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar115,auVar93);
    auVar97 = vfmadd231ps_avx512vl(auVar118,auVar82,auVar115);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar114,auVar88);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar114,auVar84);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar114,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,auVar114);
    auVar98 = vfmadd231ps_avx512vl(auVar95,auVar113,auVar85);
    auVar99 = vfmadd231ps_avx512vl(auVar96,auVar113,auVar83);
    auVar100 = vfmadd231ps_avx512vl(auVar80,auVar113,auVar86);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar87,auVar113);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar97 = vxorps_avx512vl(auVar81,auVar96);
    auVar101 = vxorps_avx512vl(ZEXT1632(auVar71),auVar96);
    auVar231._0_4_ = auVar101._0_4_ * fVar249;
    auVar231._4_4_ = auVar101._4_4_ * fVar251;
    auVar231._8_4_ = auVar101._8_4_ * fVar225;
    auVar231._12_4_ = auVar101._12_4_ * fVar210;
    auVar231._16_4_ = auVar101._16_4_ * 0.0;
    auVar231._20_4_ = auVar101._20_4_ * 0.0;
    auVar231._24_4_ = auVar101._24_4_ * 0.0;
    auVar231._28_4_ = 0;
    auVar102 = vmulps_avx512vl(auVar254._0_32_,auVar94);
    auVar80 = vsubps_avx(auVar231,auVar102);
    auVar119._4_4_ = auVar97._4_4_ * fVar250 * 0.5;
    auVar119._0_4_ = auVar97._0_4_ * fVar244 * 0.5;
    auVar119._8_4_ = auVar97._8_4_ * fVar224 * 0.5;
    auVar119._12_4_ = auVar97._12_4_ * fVar226 * 0.5;
    auVar119._16_4_ = auVar97._16_4_ * fVar233 * 0.5;
    auVar119._20_4_ = auVar97._20_4_ * fVar263 * 0.5;
    auVar119._24_4_ = auVar97._24_4_ * fVar185 * 0.5;
    auVar119._28_4_ = auVar81._28_4_;
    auVar120._4_4_ = auVar80._4_4_ * 0.5;
    auVar120._0_4_ = auVar80._0_4_ * 0.5;
    auVar120._8_4_ = auVar80._8_4_ * 0.5;
    auVar120._12_4_ = auVar80._12_4_ * 0.5;
    auVar120._16_4_ = auVar80._16_4_ * 0.5;
    auVar120._20_4_ = auVar80._20_4_ * 0.5;
    auVar120._24_4_ = auVar80._24_4_ * 0.5;
    auVar120._28_4_ = auVar80._28_4_;
    auVar121._4_4_ = (auVar102._4_4_ + fVar250 * fVar250) * 0.5;
    auVar121._0_4_ = (auVar102._0_4_ + fVar244 * fVar244) * 0.5;
    auVar121._8_4_ = (auVar102._8_4_ + fVar224 * fVar224) * 0.5;
    auVar121._12_4_ = (auVar102._12_4_ + fVar226 * fVar226) * 0.5;
    auVar121._16_4_ = (auVar102._16_4_ + fVar233 * fVar233) * 0.5;
    auVar121._20_4_ = (auVar102._20_4_ + fVar263 * fVar263) * 0.5;
    auVar121._24_4_ = (auVar102._24_4_ + fVar185 * fVar185) * 0.5;
    auVar121._28_4_ = auVar102._28_4_ + auVar243._28_4_;
    fVar244 = fVar249 * fVar249 * 0.5;
    fVar249 = fVar251 * fVar251 * 0.5;
    fVar250 = fVar225 * fVar225 * 0.5;
    fVar251 = fVar210 * fVar210 * 0.5;
    auVar124._28_4_ = auVar248._28_4_;
    auVar124._0_28_ = ZEXT1628(CONCAT412(fVar251,CONCAT48(fVar250,CONCAT44(fVar249,fVar244))));
    auVar80 = vmulps_avx512vl(local_5a0,auVar124);
    auVar125._4_4_ = local_5c0._4_4_ * fVar249;
    auVar125._0_4_ = local_5c0._0_4_ * fVar244;
    auVar125._8_4_ = local_5c0._8_4_ * fVar250;
    auVar125._12_4_ = local_5c0._12_4_ * fVar251;
    auVar125._16_4_ = local_5c0._16_4_ * 0.0;
    auVar125._20_4_ = local_5c0._20_4_ * 0.0;
    auVar125._24_4_ = local_5c0._24_4_ * 0.0;
    auVar125._28_4_ = auVar101._28_4_;
    auVar81 = vmulps_avx512vl(local_5e0,auVar124);
    auVar32._4_4_ = fVar249 * local_600._4_4_;
    auVar32._0_4_ = fVar244 * local_600._0_4_;
    auVar32._8_4_ = fVar250 * local_600._8_4_;
    auVar32._12_4_ = fVar251 * local_600._12_4_;
    auVar32._16_4_ = local_600._16_4_ * 0.0;
    auVar32._20_4_ = local_600._20_4_ * 0.0;
    auVar32._24_4_ = local_600._24_4_ * 0.0;
    auVar32._28_4_ = auVar248._28_4_;
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar121,auVar91);
    auVar97 = vfmadd231ps_avx512vl(auVar125,auVar121,auVar92);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar121,auVar93);
    auVar71 = vfmadd231ps_fma(auVar32,auVar82,auVar121);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar120,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar120,auVar84);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar120,auVar89);
    auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar90,auVar120);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar119,auVar85);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar119,auVar83);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar119,auVar86);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar87,auVar119);
    auVar33._4_4_ = auVar80._4_4_ * fVar14;
    auVar33._0_4_ = auVar80._0_4_ * fVar14;
    auVar33._8_4_ = auVar80._8_4_ * fVar14;
    auVar33._12_4_ = auVar80._12_4_ * fVar14;
    auVar33._16_4_ = auVar80._16_4_ * fVar14;
    auVar33._20_4_ = auVar80._20_4_ * fVar14;
    auVar33._24_4_ = auVar80._24_4_ * fVar14;
    auVar33._28_4_ = auVar82._28_4_;
    auVar262 = ZEXT3264(auVar33);
    auVar34._4_4_ = auVar97._4_4_ * fVar14;
    auVar34._0_4_ = auVar97._0_4_ * fVar14;
    auVar34._8_4_ = auVar97._8_4_ * fVar14;
    auVar34._12_4_ = auVar97._12_4_ * fVar14;
    auVar34._16_4_ = auVar97._16_4_ * fVar14;
    auVar34._20_4_ = auVar97._20_4_ * fVar14;
    auVar34._24_4_ = auVar97._24_4_ * fVar14;
    auVar34._28_4_ = 0x3e2aaaab;
    auVar35._4_4_ = auVar81._4_4_ * fVar14;
    auVar35._0_4_ = auVar81._0_4_ * fVar14;
    auVar35._8_4_ = auVar81._8_4_ * fVar14;
    auVar35._12_4_ = auVar81._12_4_ * fVar14;
    auVar35._16_4_ = auVar81._16_4_ * fVar14;
    auVar35._20_4_ = auVar81._20_4_ * fVar14;
    auVar35._24_4_ = auVar81._24_4_ * fVar14;
    auVar35._28_4_ = 0x40c00000;
    fVar244 = auVar101._0_4_ * fVar14;
    fVar249 = auVar101._4_4_ * fVar14;
    auVar36._4_4_ = fVar249;
    auVar36._0_4_ = fVar244;
    fVar250 = auVar101._8_4_ * fVar14;
    auVar36._8_4_ = fVar250;
    fVar251 = auVar101._12_4_ * fVar14;
    auVar36._12_4_ = fVar251;
    fVar224 = auVar101._16_4_ * fVar14;
    auVar36._16_4_ = fVar224;
    fVar225 = auVar101._20_4_ * fVar14;
    auVar36._20_4_ = fVar225;
    fVar226 = auVar101._24_4_ * fVar14;
    auVar36._24_4_ = fVar226;
    auVar36._28_4_ = fVar14;
    auVar71 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
    auVar101 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar253 = ZEXT3264(auVar101);
    auVar102 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar255 = ZEXT3264(auVar102);
    auVar96 = ZEXT1632(auVar71);
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar96);
    auVar257 = ZEXT3264(auVar103);
    auVar232._0_4_ = fVar244 + auVar95._0_4_;
    auVar232._4_4_ = fVar249 + auVar95._4_4_;
    auVar232._8_4_ = fVar250 + auVar95._8_4_;
    auVar232._12_4_ = fVar251 + auVar95._12_4_;
    auVar232._16_4_ = fVar224 + auVar95._16_4_;
    auVar232._20_4_ = fVar225 + auVar95._20_4_;
    auVar232._24_4_ = fVar226 + auVar95._24_4_;
    auVar232._28_4_ = fVar14 + auVar95._28_4_;
    auVar80 = vmaxps_avx(auVar95,auVar232);
    auVar81 = vminps_avx(auVar95,auVar232);
    auVar104 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar96);
    auVar105 = vpermt2ps_avx512vl(auVar33,_DAT_01fb9fc0,auVar96);
    auVar106 = vpermt2ps_avx512vl(auVar34,_DAT_01fb9fc0,auVar96);
    auVar118 = ZEXT1632(auVar71);
    auVar107 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9fc0,auVar118);
    auVar95 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9fc0,auVar118);
    auVar108 = vsubps_avx512vl(auVar104,auVar95);
    auVar95 = vsubps_avx(auVar101,auVar98);
    auVar248 = ZEXT3264(auVar95);
    auVar96 = vsubps_avx(auVar102,auVar99);
    auVar243 = ZEXT3264(auVar96);
    auVar97 = vsubps_avx(auVar103,auVar100);
    auVar109 = vmulps_avx512vl(auVar96,auVar35);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar34,auVar97);
    auVar110 = vmulps_avx512vl(auVar97,auVar33);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar35,auVar95);
    auVar111 = vmulps_avx512vl(auVar95,auVar34);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar33,auVar96);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar97,auVar97);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar96,auVar96);
    auVar111 = vfmadd231ps_avx512vl(auVar110,auVar95,auVar95);
    auVar110 = vrcp14ps_avx512vl(auVar111);
    auVar112 = vfnmadd213ps_avx512vl(auVar110,auVar111,auVar264);
    auVar110 = vfmadd132ps_avx512vl(auVar112,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar109,auVar110);
    auVar112 = vmulps_avx512vl(auVar96,auVar107);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar106,auVar97);
    auVar113 = vmulps_avx512vl(auVar97,auVar105);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar107,auVar95);
    auVar114 = vmulps_avx512vl(auVar95,auVar106);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar105,auVar96);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar110 = vmulps_avx512vl(auVar112,auVar110);
    auVar109 = vmaxps_avx512vl(auVar109,auVar110);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar110 = vmaxps_avx512vl(auVar108,auVar104);
    auVar80 = vmaxps_avx512vl(auVar80,auVar110);
    auVar112 = vaddps_avx512vl(auVar109,auVar80);
    auVar80 = vminps_avx512vl(auVar108,auVar104);
    auVar80 = vminps_avx(auVar81,auVar80);
    auVar80 = vsubps_avx512vl(auVar80,auVar109);
    auVar108._8_4_ = 0x3f800002;
    auVar108._0_8_ = 0x3f8000023f800002;
    auVar108._12_4_ = 0x3f800002;
    auVar108._16_4_ = 0x3f800002;
    auVar108._20_4_ = 0x3f800002;
    auVar108._24_4_ = 0x3f800002;
    auVar108._28_4_ = 0x3f800002;
    auVar81 = vmulps_avx512vl(auVar112,auVar108);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    auVar80 = vmulps_avx512vl(auVar80,auVar109);
    auVar81 = vmulps_avx512vl(auVar81,auVar81);
    auVar104 = vrsqrt14ps_avx512vl(auVar111);
    auVar110._8_4_ = 0xbf000000;
    auVar110._0_8_ = 0xbf000000bf000000;
    auVar110._12_4_ = 0xbf000000;
    auVar110._16_4_ = 0xbf000000;
    auVar110._20_4_ = 0xbf000000;
    auVar110._24_4_ = 0xbf000000;
    auVar110._28_4_ = 0xbf000000;
    auVar108 = vmulps_avx512vl(auVar111,auVar110);
    fVar244 = auVar104._0_4_;
    fVar249 = auVar104._4_4_;
    fVar250 = auVar104._8_4_;
    fVar251 = auVar104._12_4_;
    fVar224 = auVar104._16_4_;
    fVar225 = auVar104._20_4_;
    fVar226 = auVar104._24_4_;
    auVar37._4_4_ = fVar249 * fVar249 * fVar249 * auVar108._4_4_;
    auVar37._0_4_ = fVar244 * fVar244 * fVar244 * auVar108._0_4_;
    auVar37._8_4_ = fVar250 * fVar250 * fVar250 * auVar108._8_4_;
    auVar37._12_4_ = fVar251 * fVar251 * fVar251 * auVar108._12_4_;
    auVar37._16_4_ = fVar224 * fVar224 * fVar224 * auVar108._16_4_;
    auVar37._20_4_ = fVar225 * fVar225 * fVar225 * auVar108._20_4_;
    auVar37._24_4_ = fVar226 * fVar226 * fVar226 * auVar108._24_4_;
    auVar37._28_4_ = auVar112._28_4_;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_avx512vl(auVar37,auVar104,auVar111);
    auVar108 = vmulps_avx512vl(auVar95,auVar104);
    auVar109 = vmulps_avx512vl(auVar96,auVar104);
    auVar110 = vmulps_avx512vl(auVar97,auVar104);
    auVar111 = vsubps_avx512vl(auVar118,auVar98);
    auVar112 = vsubps_avx512vl(auVar118,auVar99);
    auVar113 = vsubps_avx512vl(auVar118,auVar100);
    auVar114 = vmulps_avx512vl(local_840,auVar113);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_820,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_800,auVar111);
    auVar115 = vmulps_avx512vl(auVar113,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar111);
    auVar116 = vmulps_avx512vl(local_840,auVar110);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar109,local_820);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar108,local_800);
    auVar110 = vmulps_avx512vl(auVar113,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar108);
    auVar109 = vmulps_avx512vl(auVar116,auVar116);
    auVar110 = vsubps_avx512vl(local_560,auVar109);
    auVar117 = vmulps_avx512vl(auVar116,auVar108);
    auVar114 = vsubps_avx512vl(auVar114,auVar117);
    auVar114 = vaddps_avx512vl(auVar114,auVar114);
    auVar117 = vmulps_avx512vl(auVar108,auVar108);
    local_a00 = vsubps_avx512vl(auVar115,auVar117);
    auVar81 = vsubps_avx512vl(local_a00,auVar81);
    auVar115 = vmulps_avx512vl(auVar114,auVar114);
    auVar94 = vmulps_avx512vl(auVar110,auVar94);
    auVar117 = vmulps_avx512vl(auVar94,auVar81);
    auVar117 = vsubps_avx512vl(auVar115,auVar117);
    uVar67 = vcmpps_avx512vl(auVar117,auVar118,5);
    bVar53 = (byte)uVar67;
    if (bVar53 == 0) {
LAB_019e2636:
      auVar161 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      local_7c0._0_32_ = auVar115;
      auVar117 = vsqrtps_avx512vl(auVar117);
      auVar118 = vaddps_avx512vl(auVar110,auVar110);
      auVar119 = vrcp14ps_avx512vl(auVar118);
      auVar120 = vfnmadd213ps_avx512vl(auVar119,auVar118,auVar264);
      auVar120 = vfmadd132ps_avx512vl(auVar120,auVar119,auVar119);
      auVar264._8_4_ = 0x80000000;
      auVar264._0_8_ = 0x8000000080000000;
      auVar264._12_4_ = 0x80000000;
      auVar264._16_4_ = 0x80000000;
      auVar264._20_4_ = 0x80000000;
      auVar264._24_4_ = 0x80000000;
      auVar264._28_4_ = 0x80000000;
      _local_880 = vxorps_avx512vl(auVar114,auVar264);
      auVar121 = vsubps_avx512vl(_local_880,auVar117);
      local_860 = vmulps_avx512vl(auVar121,auVar120);
      auVar117 = vsubps_avx512vl(auVar117,auVar114);
      local_8a0 = vmulps_avx512vl(auVar117,auVar120);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar120 = vblendmps_avx512vl(auVar117,local_860);
      auVar122._0_4_ =
           (uint)(bVar53 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar117._0_4_;
      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar66 * auVar120._4_4_ | (uint)!bVar66 * auVar117._4_4_;
      bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar66 * auVar120._8_4_ | (uint)!bVar66 * auVar117._8_4_;
      bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar66 * auVar120._12_4_ | (uint)!bVar66 * auVar117._12_4_;
      bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar66 * auVar120._16_4_ | (uint)!bVar66 * auVar117._16_4_;
      bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar66 * auVar120._20_4_ | (uint)!bVar66 * auVar117._20_4_;
      bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar66 * auVar120._24_4_ | (uint)!bVar66 * auVar117._24_4_;
      bVar66 = SUB81(uVar67 >> 7,0);
      auVar122._28_4_ = (uint)bVar66 * auVar120._28_4_ | (uint)!bVar66 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar117,local_8a0);
      auVar123._0_4_ =
           (uint)(bVar53 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar117._0_4_;
      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar66 * auVar120._4_4_ | (uint)!bVar66 * auVar117._4_4_;
      bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar66 * auVar120._8_4_ | (uint)!bVar66 * auVar117._8_4_;
      bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar66 * auVar120._12_4_ | (uint)!bVar66 * auVar117._12_4_;
      bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar66 * auVar120._16_4_ | (uint)!bVar66 * auVar117._16_4_;
      bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar66 * auVar120._20_4_ | (uint)!bVar66 * auVar117._20_4_;
      bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar66 * auVar120._24_4_ | (uint)!bVar66 * auVar117._24_4_;
      bVar66 = SUB81(uVar67 >> 7,0);
      auVar123._28_4_ = (uint)bVar66 * auVar120._28_4_ | (uint)!bVar66 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar117);
      local_8c0 = vmaxps_avx512vl(local_580,auVar117);
      auVar25._8_4_ = 0x36000000;
      auVar25._0_8_ = 0x3600000036000000;
      auVar25._12_4_ = 0x36000000;
      auVar25._16_4_ = 0x36000000;
      auVar25._20_4_ = 0x36000000;
      auVar25._24_4_ = 0x36000000;
      auVar25._28_4_ = 0x36000000;
      local_8e0 = vmulps_avx512vl(local_8c0,auVar25);
      vandps_avx512vl(auVar110,auVar117);
      uVar59 = vcmpps_avx512vl(local_8e0,local_8e0,1);
      uVar67 = uVar67 & uVar59;
      bVar63 = (byte)uVar67;
      if (bVar63 != 0) {
        uVar59 = vcmpps_avx512vl(auVar81,_DAT_01f7b000,2);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar110 = vblendmps_avx512vl(auVar81,auVar109);
        bVar58 = (byte)uVar59;
        uVar68 = (uint)(bVar58 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar58 & 1) * local_8e0._0_4_;
        bVar66 = (bool)((byte)(uVar59 >> 1) & 1);
        uVar136 = (uint)bVar66 * auVar110._4_4_ | (uint)!bVar66 * local_8e0._4_4_;
        bVar66 = (bool)((byte)(uVar59 >> 2) & 1);
        uVar137 = (uint)bVar66 * auVar110._8_4_ | (uint)!bVar66 * local_8e0._8_4_;
        bVar66 = (bool)((byte)(uVar59 >> 3) & 1);
        uVar138 = (uint)bVar66 * auVar110._12_4_ | (uint)!bVar66 * local_8e0._12_4_;
        bVar66 = (bool)((byte)(uVar59 >> 4) & 1);
        uVar139 = (uint)bVar66 * auVar110._16_4_ | (uint)!bVar66 * local_8e0._16_4_;
        bVar66 = (bool)((byte)(uVar59 >> 5) & 1);
        uVar140 = (uint)bVar66 * auVar110._20_4_ | (uint)!bVar66 * local_8e0._20_4_;
        bVar66 = (bool)((byte)(uVar59 >> 6) & 1);
        uVar141 = (uint)bVar66 * auVar110._24_4_ | (uint)!bVar66 * local_8e0._24_4_;
        bVar66 = SUB81(uVar59 >> 7,0);
        uVar142 = (uint)bVar66 * auVar110._28_4_ | (uint)!bVar66 * local_8e0._28_4_;
        auVar122._0_4_ = (bVar63 & 1) * uVar68 | !(bool)(bVar63 & 1) * auVar122._0_4_;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar122._4_4_ = bVar66 * uVar136 | !bVar66 * auVar122._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar122._8_4_ = bVar66 * uVar137 | !bVar66 * auVar122._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar122._12_4_ = bVar66 * uVar138 | !bVar66 * auVar122._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar122._16_4_ = bVar66 * uVar139 | !bVar66 * auVar122._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar122._20_4_ = bVar66 * uVar140 | !bVar66 * auVar122._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar122._24_4_ = bVar66 * uVar141 | !bVar66 * auVar122._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar122._28_4_ = bVar66 * uVar142 | !bVar66 * auVar122._28_4_;
        auVar81 = vblendmps_avx512vl(auVar109,auVar81);
        bVar66 = (bool)((byte)(uVar59 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar59 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar59 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar59 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar59 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
        bVar11 = SUB81(uVar59 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar63 & 1) *
             ((uint)(bVar58 & 1) * auVar81._0_4_ | !(bool)(bVar58 & 1) * uVar68) |
             !(bool)(bVar63 & 1) * auVar123._0_4_;
        bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar5 * ((uint)bVar66 * auVar81._4_4_ | !bVar66 * uVar136) |
             !bVar5 * auVar123._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar66 * ((uint)bVar6 * auVar81._8_4_ | !bVar6 * uVar137) |
             !bVar66 * auVar123._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar66 * ((uint)bVar7 * auVar81._12_4_ | !bVar7 * uVar138) |
             !bVar66 * auVar123._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar66 * ((uint)bVar8 * auVar81._16_4_ | !bVar8 * uVar139) |
             !bVar66 * auVar123._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar66 * ((uint)bVar9 * auVar81._20_4_ | !bVar9 * uVar140) |
             !bVar66 * auVar123._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar66 * ((uint)bVar10 * auVar81._24_4_ | !bVar10 * uVar141) |
             !bVar66 * auVar123._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar66 * ((uint)bVar11 * auVar81._28_4_ | !bVar11 * uVar142) |
             !bVar66 * auVar123._28_4_;
        bVar53 = (~bVar63 | bVar58) & bVar53;
      }
      if ((bVar53 & 0x7f) == 0) {
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar265 = ZEXT3264(auVar80);
        auVar161 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar107 = vxorps_avx512vl(auVar107,auVar81);
        auVar105 = vxorps_avx512vl(auVar105,auVar81);
        auVar161 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        auVar106 = vxorps_avx512vl(auVar106,auVar81);
        auVar71 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                 ZEXT416((uint)local_940._0_4_));
        auVar109 = vbroadcastss_avx512vl(auVar71);
        auVar109 = vminps_avx512vl(auVar109,auVar123);
        auVar52._4_4_ = fStack_61c;
        auVar52._0_4_ = local_620;
        auVar52._8_4_ = fStack_618;
        auVar52._12_4_ = fStack_614;
        auVar52._16_4_ = fStack_610;
        auVar52._20_4_ = fStack_60c;
        auVar52._24_4_ = fStack_608;
        auVar52._28_4_ = fStack_604;
        auVar110 = vmaxps_avx512vl(auVar52,auVar122);
        auVar113 = vmulps_avx512vl(auVar35,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar112,auVar34,auVar113);
        auVar71 = vfmadd213ps_fma(auVar111,auVar33,auVar112);
        auVar111 = vmulps_avx512vl(local_840,auVar35);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_820,auVar34);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_800,auVar33);
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar111,auVar112);
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar15 = vcmpps_avx512vl(auVar112,auVar113,1);
        auVar117 = vxorps_avx512vl(ZEXT1632(auVar71),auVar81);
        auVar120 = vrcp14ps_avx512vl(auVar111);
        auVar121 = vxorps_avx512vl(auVar111,auVar81);
        auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar125 = vfnmadd213ps_avx512vl(auVar120,auVar111,auVar124);
        auVar71 = vfmadd132ps_fma(auVar125,auVar120,auVar120);
        fVar244 = auVar71._0_4_ * auVar117._0_4_;
        fVar249 = auVar71._4_4_ * auVar117._4_4_;
        auVar38._4_4_ = fVar249;
        auVar38._0_4_ = fVar244;
        fVar250 = auVar71._8_4_ * auVar117._8_4_;
        auVar38._8_4_ = fVar250;
        fVar251 = auVar71._12_4_ * auVar117._12_4_;
        auVar38._12_4_ = fVar251;
        fVar224 = auVar117._16_4_ * 0.0;
        auVar38._16_4_ = fVar224;
        fVar225 = auVar117._20_4_ * 0.0;
        auVar38._20_4_ = fVar225;
        fVar226 = auVar117._24_4_ * 0.0;
        auVar38._24_4_ = fVar226;
        auVar38._28_4_ = auVar117._28_4_;
        uVar17 = vcmpps_avx512vl(auVar111,auVar121,1);
        bVar63 = (byte)uVar15 | (byte)uVar17;
        auVar260._8_4_ = 0xff800000;
        auVar260._0_8_ = 0xff800000ff800000;
        auVar260._12_4_ = 0xff800000;
        auVar260._16_4_ = 0xff800000;
        auVar260._20_4_ = 0xff800000;
        auVar260._24_4_ = 0xff800000;
        auVar260._28_4_ = 0xff800000;
        auVar120 = vblendmps_avx512vl(auVar38,auVar260);
        auVar126._0_4_ = (uint)(bVar63 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar63 & 1) * -0x800000
        ;
        bVar66 = (bool)(bVar63 >> 1 & 1);
        auVar126._4_4_ = (uint)bVar66 * auVar120._4_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)(bVar63 >> 2 & 1);
        auVar126._8_4_ = (uint)bVar66 * auVar120._8_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)(bVar63 >> 3 & 1);
        auVar126._12_4_ = (uint)bVar66 * auVar120._12_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)(bVar63 >> 4 & 1);
        auVar126._16_4_ = (uint)bVar66 * auVar120._16_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)(bVar63 >> 5 & 1);
        auVar126._20_4_ = (uint)bVar66 * auVar120._20_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)(bVar63 >> 6 & 1);
        auVar126._24_4_ = (uint)bVar66 * auVar120._24_4_ | (uint)!bVar66 * -0x800000;
        auVar126._28_4_ =
             (uint)(bVar63 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar63 >> 7) * -0x800000;
        auVar120 = vmaxps_avx512vl(auVar110,auVar126);
        auVar262 = ZEXT3264(auVar120);
        uVar17 = vcmpps_avx512vl(auVar111,auVar121,6);
        bVar63 = (byte)uVar15 | (byte)uVar17;
        auVar127._0_4_ = (uint)(bVar63 & 1) * 0x7f800000 | (uint)!(bool)(bVar63 & 1) * (int)fVar244;
        bVar66 = (bool)(bVar63 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar249;
        bVar66 = (bool)(bVar63 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar250;
        bVar66 = (bool)(bVar63 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar251;
        bVar66 = (bool)(bVar63 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar224;
        bVar66 = (bool)(bVar63 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar225;
        bVar66 = (bool)(bVar63 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar226;
        auVar127._28_4_ =
             (uint)(bVar63 >> 7) * 0x7f800000 | (uint)!(bool)(bVar63 >> 7) * auVar117._28_4_;
        auVar109 = vminps_avx512vl(auVar109,auVar127);
        auVar71 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar71),auVar101);
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar71),auVar102);
        auVar110 = ZEXT1632(auVar71);
        auVar103 = vsubps_avx512vl(auVar110,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar107);
        auVar102 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar102);
        auVar101 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar101);
        auVar102 = vmulps_avx512vl(local_840,auVar107);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_820,auVar106);
        auVar265 = ZEXT3264(auVar124);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_800,auVar105);
        vandps_avx512vl(auVar102,auVar112);
        uVar15 = vcmpps_avx512vl(auVar102,auVar113,1);
        auVar101 = vxorps_avx512vl(auVar101,auVar81);
        auVar103 = vrcp14ps_avx512vl(auVar102);
        auVar105 = vxorps_avx512vl(auVar102,auVar81);
        auVar257 = ZEXT3264(auVar105);
        auVar81 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar124);
        auVar71 = vfmadd132ps_fma(auVar81,auVar103,auVar103);
        fVar244 = auVar71._0_4_ * auVar101._0_4_;
        fVar249 = auVar71._4_4_ * auVar101._4_4_;
        auVar39._4_4_ = fVar249;
        auVar39._0_4_ = fVar244;
        fVar250 = auVar71._8_4_ * auVar101._8_4_;
        auVar39._8_4_ = fVar250;
        fVar251 = auVar71._12_4_ * auVar101._12_4_;
        auVar39._12_4_ = fVar251;
        fVar224 = auVar101._16_4_ * 0.0;
        auVar39._16_4_ = fVar224;
        fVar225 = auVar101._20_4_ * 0.0;
        auVar39._20_4_ = fVar225;
        fVar226 = auVar101._24_4_ * 0.0;
        auVar39._24_4_ = fVar226;
        auVar39._28_4_ = auVar101._28_4_;
        uVar17 = vcmpps_avx512vl(auVar102,auVar105,1);
        bVar63 = (byte)uVar15 | (byte)uVar17;
        auVar26._8_4_ = 0xff800000;
        auVar26._0_8_ = 0xff800000ff800000;
        auVar26._12_4_ = 0xff800000;
        auVar26._16_4_ = 0xff800000;
        auVar26._20_4_ = 0xff800000;
        auVar26._24_4_ = 0xff800000;
        auVar26._28_4_ = 0xff800000;
        auVar81 = vblendmps_avx512vl(auVar39,auVar26);
        auVar128._0_4_ =
             (uint)(bVar63 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar103._0_4_;
        bVar66 = (bool)(bVar63 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * auVar103._4_4_;
        bVar66 = (bool)(bVar63 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * auVar103._8_4_;
        bVar66 = (bool)(bVar63 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * auVar103._12_4_;
        bVar66 = (bool)(bVar63 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar66 * auVar81._16_4_ | (uint)!bVar66 * auVar103._16_4_;
        bVar66 = (bool)(bVar63 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar66 * auVar81._20_4_ | (uint)!bVar66 * auVar103._20_4_;
        bVar66 = (bool)(bVar63 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar66 * auVar81._24_4_ | (uint)!bVar66 * auVar103._24_4_;
        auVar128._28_4_ =
             (uint)(bVar63 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar103._28_4_;
        auVar81 = vmaxps_avx(auVar120,auVar128);
        auVar255 = ZEXT3264(auVar81);
        uVar17 = vcmpps_avx512vl(auVar102,auVar105,6);
        bVar63 = (byte)uVar15 | (byte)uVar17;
        auVar129._0_4_ = (uint)(bVar63 & 1) * 0x7f800000 | (uint)!(bool)(bVar63 & 1) * (int)fVar244;
        bVar66 = (bool)(bVar63 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar249;
        bVar66 = (bool)(bVar63 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar250;
        bVar66 = (bool)(bVar63 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar251;
        bVar66 = (bool)(bVar63 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar224;
        bVar66 = (bool)(bVar63 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar225;
        bVar66 = (bool)(bVar63 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar226;
        auVar129._28_4_ =
             (uint)(bVar63 >> 7) * 0x7f800000 | (uint)!(bool)(bVar63 >> 7) * auVar101._28_4_;
        local_680 = vminps_avx(auVar109,auVar129);
        auVar253 = ZEXT3264(local_680);
        uVar15 = vcmpps_avx512vl(auVar81,local_680,2);
        bVar53 = bVar53 & 0x7f & (byte)uVar15;
        if (bVar53 == 0) goto LAB_019e2636;
        auVar102 = vmaxps_avx512vl(auVar110,auVar80);
        auVar80 = vfmadd213ps_avx512vl(local_860,auVar116,auVar108);
        fVar244 = auVar104._0_4_;
        fVar249 = auVar104._4_4_;
        auVar40._4_4_ = fVar249 * auVar80._4_4_;
        auVar40._0_4_ = fVar244 * auVar80._0_4_;
        fVar250 = auVar104._8_4_;
        auVar40._8_4_ = fVar250 * auVar80._8_4_;
        fVar251 = auVar104._12_4_;
        auVar40._12_4_ = fVar251 * auVar80._12_4_;
        fVar224 = auVar104._16_4_;
        auVar40._16_4_ = fVar224 * auVar80._16_4_;
        fVar225 = auVar104._20_4_;
        auVar40._20_4_ = fVar225 * auVar80._20_4_;
        fVar226 = auVar104._24_4_;
        auVar40._24_4_ = fVar226 * auVar80._24_4_;
        auVar40._28_4_ = auVar80._28_4_;
        auVar80 = vfmadd213ps_avx512vl(local_8a0,auVar116,auVar108);
        auVar41._4_4_ = fVar249 * auVar80._4_4_;
        auVar41._0_4_ = fVar244 * auVar80._0_4_;
        auVar41._8_4_ = fVar250 * auVar80._8_4_;
        auVar41._12_4_ = fVar251 * auVar80._12_4_;
        auVar41._16_4_ = fVar224 * auVar80._16_4_;
        auVar41._20_4_ = fVar225 * auVar80._20_4_;
        auVar41._24_4_ = fVar226 * auVar80._24_4_;
        auVar41._28_4_ = auVar80._28_4_;
        auVar80 = vminps_avx512vl(auVar40,auVar124);
        auVar101 = ZEXT832(0) << 0x20;
        auVar80 = vmaxps_avx(auVar80,ZEXT832(0) << 0x20);
        auVar103 = vminps_avx512vl(auVar41,auVar124);
        auVar42._4_4_ = (auVar80._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar80._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar80._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar80._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar80._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar80._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar80._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar80._28_4_ + 7.0;
        local_520 = vfmadd213ps_avx512vl(auVar42,auVar153,auVar230);
        auVar80 = vmaxps_avx(auVar103,ZEXT832(0) << 0x20);
        auVar43._4_4_ = (auVar80._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar80._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar80._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar80._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar80._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar80._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar80._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar80._28_4_ + 7.0;
        local_540 = vfmadd213ps_avx512vl(auVar43,auVar153,auVar230);
        auVar44._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar44._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar44._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar44._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar44._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar44._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar44._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar44._28_4_ = auVar102._28_4_;
        auVar80 = vsubps_avx(local_a00,auVar44);
        local_aa0 = auVar94._0_4_;
        fStack_a9c = auVar94._4_4_;
        fStack_a98 = auVar94._8_4_;
        fStack_a94 = auVar94._12_4_;
        fStack_a90 = auVar94._16_4_;
        fStack_a8c = auVar94._20_4_;
        fStack_a88 = auVar94._24_4_;
        auVar45._4_4_ = auVar80._4_4_ * fStack_a9c;
        auVar45._0_4_ = auVar80._0_4_ * local_aa0;
        auVar45._8_4_ = auVar80._8_4_ * fStack_a98;
        auVar45._12_4_ = auVar80._12_4_ * fStack_a94;
        auVar45._16_4_ = auVar80._16_4_ * fStack_a90;
        auVar45._20_4_ = auVar80._20_4_ * fStack_a8c;
        auVar45._24_4_ = auVar80._24_4_ * fStack_a88;
        auVar45._28_4_ = auVar102._28_4_;
        auVar94 = vsubps_avx(auVar115,auVar45);
        uVar15 = vcmpps_avx512vl(auVar94,ZEXT832(0) << 0x20,5);
        bVar63 = (byte)uVar15;
        if (bVar63 == 0) {
          bVar63 = 0;
          auVar95 = ZEXT832(0) << 0x20;
          auVar243 = ZEXT864(0) << 0x20;
          auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar255 = ZEXT864(0) << 0x20;
          auVar130._8_4_ = 0x7f800000;
          auVar130._0_8_ = 0x7f8000007f800000;
          auVar130._12_4_ = 0x7f800000;
          auVar130._16_4_ = 0x7f800000;
          auVar130._20_4_ = 0x7f800000;
          auVar130._24_4_ = 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar131._8_4_ = 0xff800000;
          auVar131._0_8_ = 0xff800000ff800000;
          auVar131._12_4_ = 0xff800000;
          auVar131._16_4_ = 0xff800000;
          auVar131._20_4_ = 0xff800000;
          auVar131._24_4_ = 0xff800000;
          auVar131._28_4_ = 0xff800000;
        }
        else {
          auVar72 = vxorps_avx512vl(auVar145,auVar145);
          uVar67 = vcmpps_avx512vl(auVar94,auVar110,5);
          auVar94 = vsqrtps_avx(auVar94);
          auVar101 = vfnmadd213ps_avx512vl(auVar118,auVar119,auVar124);
          auVar102 = vfmadd132ps_avx512vl(auVar101,auVar119,auVar119);
          auVar101 = vsubps_avx(_local_880,auVar94);
          auVar105 = vmulps_avx512vl(auVar101,auVar102);
          auVar94 = vsubps_avx512vl(auVar94,auVar114);
          auVar106 = vmulps_avx512vl(auVar94,auVar102);
          auVar94 = vfmadd213ps_avx512vl(auVar116,auVar105,auVar108);
          auVar46._4_4_ = fVar249 * auVar94._4_4_;
          auVar46._0_4_ = fVar244 * auVar94._0_4_;
          auVar46._8_4_ = fVar250 * auVar94._8_4_;
          auVar46._12_4_ = fVar251 * auVar94._12_4_;
          auVar46._16_4_ = fVar224 * auVar94._16_4_;
          auVar46._20_4_ = fVar225 * auVar94._20_4_;
          auVar46._24_4_ = fVar226 * auVar94._24_4_;
          auVar46._28_4_ = auVar103._28_4_;
          auVar94 = vmulps_avx512vl(local_800,auVar105);
          auVar101 = vmulps_avx512vl(local_820,auVar105);
          auVar103 = vmulps_avx512vl(local_840,auVar105);
          auVar102 = vfmadd213ps_avx512vl(auVar95,auVar46,auVar98);
          auVar94 = vsubps_avx512vl(auVar94,auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar96,auVar46,auVar99);
          auVar102 = vsubps_avx512vl(auVar101,auVar102);
          auVar71 = vfmadd213ps_fma(auVar46,auVar97,auVar100);
          auVar101 = vsubps_avx(auVar103,ZEXT1632(auVar71));
          auVar255 = ZEXT3264(auVar101);
          auVar101 = vfmadd213ps_avx512vl(auVar116,auVar106,auVar108);
          auVar103 = vmulps_avx512vl(auVar104,auVar101);
          auVar101 = vmulps_avx512vl(local_800,auVar106);
          auVar104 = vmulps_avx512vl(local_820,auVar106);
          auVar107 = vmulps_avx512vl(local_840,auVar106);
          auVar71 = vfmadd213ps_fma(auVar95,auVar103,auVar98);
          auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar96,auVar103,auVar99);
          auVar95 = vsubps_avx512vl(auVar104,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar97,auVar103,auVar100);
          auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar71));
          auVar243 = ZEXT3264(auVar96);
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar154,auVar105);
          bVar66 = (bool)((byte)uVar67 & 1);
          auVar130._0_4_ = (uint)bVar66 * auVar96._0_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar66 * auVar96._4_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar66 * auVar96._8_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar66 * auVar96._12_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar66 * auVar96._16_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar66 * auVar96._20_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar66 * auVar96._24_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = SUB81(uVar67 >> 7,0);
          auVar130._28_4_ = (uint)bVar66 * auVar96._28_4_ | (uint)!bVar66 * 0x7f800000;
          auVar204._8_4_ = 0xff800000;
          auVar204._0_8_ = 0xff800000ff800000;
          auVar204._12_4_ = 0xff800000;
          auVar204._16_4_ = 0xff800000;
          auVar204._20_4_ = 0xff800000;
          auVar204._24_4_ = 0xff800000;
          auVar204._28_4_ = 0xff800000;
          auVar96 = vblendmps_avx512vl(auVar204,auVar106);
          bVar66 = (bool)((byte)uVar67 & 1);
          auVar131._0_4_ = (uint)bVar66 * auVar96._0_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar66 * auVar96._4_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar66 * auVar96._8_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar66 * auVar96._12_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar66 * auVar96._16_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar66 * auVar96._20_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar66 * auVar96._24_4_ | (uint)!bVar66 * -0x800000;
          bVar66 = SUB81(uVar67 >> 7,0);
          auVar131._28_4_ = (uint)bVar66 * auVar96._28_4_ | (uint)!bVar66 * -0x800000;
          auVar27._8_4_ = 0x36000000;
          auVar27._0_8_ = 0x3600000036000000;
          auVar27._12_4_ = 0x36000000;
          auVar27._16_4_ = 0x36000000;
          auVar27._20_4_ = 0x36000000;
          auVar27._24_4_ = 0x36000000;
          auVar27._28_4_ = 0x36000000;
          auVar96 = vmulps_avx512vl(local_8c0,auVar27);
          uVar59 = vcmpps_avx512vl(auVar96,local_8e0,0xe);
          uVar67 = uVar67 & uVar59;
          bVar58 = (byte)uVar67;
          if (bVar58 != 0) {
            uVar59 = vcmpps_avx512vl(auVar80,ZEXT1632(auVar72),2);
            auVar247._8_4_ = 0x7f800000;
            auVar247._0_8_ = 0x7f8000007f800000;
            auVar247._12_4_ = 0x7f800000;
            auVar247._16_4_ = 0x7f800000;
            auVar247._20_4_ = 0x7f800000;
            auVar247._24_4_ = 0x7f800000;
            auVar247._28_4_ = 0x7f800000;
            auVar261._8_4_ = 0xff800000;
            auVar261._0_8_ = 0xff800000ff800000;
            auVar261._12_4_ = 0xff800000;
            auVar261._16_4_ = 0xff800000;
            auVar261._20_4_ = 0xff800000;
            auVar261._24_4_ = 0xff800000;
            auVar261._28_4_ = 0xff800000;
            auVar80 = vblendmps_avx512vl(auVar247,auVar261);
            bVar54 = (byte)uVar59;
            uVar68 = (uint)(bVar54 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar96._0_4_;
            bVar66 = (bool)((byte)(uVar59 >> 1) & 1);
            uVar136 = (uint)bVar66 * auVar80._4_4_ | (uint)!bVar66 * auVar96._4_4_;
            bVar66 = (bool)((byte)(uVar59 >> 2) & 1);
            uVar137 = (uint)bVar66 * auVar80._8_4_ | (uint)!bVar66 * auVar96._8_4_;
            bVar66 = (bool)((byte)(uVar59 >> 3) & 1);
            uVar138 = (uint)bVar66 * auVar80._12_4_ | (uint)!bVar66 * auVar96._12_4_;
            bVar66 = (bool)((byte)(uVar59 >> 4) & 1);
            uVar139 = (uint)bVar66 * auVar80._16_4_ | (uint)!bVar66 * auVar96._16_4_;
            bVar66 = (bool)((byte)(uVar59 >> 5) & 1);
            uVar140 = (uint)bVar66 * auVar80._20_4_ | (uint)!bVar66 * auVar96._20_4_;
            bVar66 = (bool)((byte)(uVar59 >> 6) & 1);
            uVar141 = (uint)bVar66 * auVar80._24_4_ | (uint)!bVar66 * auVar96._24_4_;
            bVar66 = SUB81(uVar59 >> 7,0);
            uVar142 = (uint)bVar66 * auVar80._28_4_ | (uint)!bVar66 * auVar96._28_4_;
            auVar130._0_4_ = (bVar58 & 1) * uVar68 | !(bool)(bVar58 & 1) * auVar130._0_4_;
            bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar130._4_4_ = bVar66 * uVar136 | !bVar66 * auVar130._4_4_;
            bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar130._8_4_ = bVar66 * uVar137 | !bVar66 * auVar130._8_4_;
            bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar130._12_4_ = bVar66 * uVar138 | !bVar66 * auVar130._12_4_;
            bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar130._16_4_ = bVar66 * uVar139 | !bVar66 * auVar130._16_4_;
            bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar130._20_4_ = bVar66 * uVar140 | !bVar66 * auVar130._20_4_;
            bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar130._24_4_ = bVar66 * uVar141 | !bVar66 * auVar130._24_4_;
            bVar66 = SUB81(uVar67 >> 7,0);
            auVar130._28_4_ = bVar66 * uVar142 | !bVar66 * auVar130._28_4_;
            auVar80 = vblendmps_avx512vl(auVar261,auVar247);
            bVar66 = (bool)((byte)(uVar59 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar59 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar59 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar59 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar59 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
            bVar11 = SUB81(uVar59 >> 7,0);
            auVar131._0_4_ =
                 (uint)(bVar58 & 1) *
                 ((uint)(bVar54 & 1) * auVar80._0_4_ | !(bool)(bVar54 & 1) * uVar68) |
                 !(bool)(bVar58 & 1) * auVar131._0_4_;
            bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar131._4_4_ =
                 (uint)bVar5 * ((uint)bVar66 * auVar80._4_4_ | !bVar66 * uVar136) |
                 !bVar5 * auVar131._4_4_;
            bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar131._8_4_ =
                 (uint)bVar66 * ((uint)bVar6 * auVar80._8_4_ | !bVar6 * uVar137) |
                 !bVar66 * auVar131._8_4_;
            bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar131._12_4_ =
                 (uint)bVar66 * ((uint)bVar7 * auVar80._12_4_ | !bVar7 * uVar138) |
                 !bVar66 * auVar131._12_4_;
            bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar131._16_4_ =
                 (uint)bVar66 * ((uint)bVar8 * auVar80._16_4_ | !bVar8 * uVar139) |
                 !bVar66 * auVar131._16_4_;
            bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar131._20_4_ =
                 (uint)bVar66 * ((uint)bVar9 * auVar80._20_4_ | !bVar9 * uVar140) |
                 !bVar66 * auVar131._20_4_;
            bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar131._24_4_ =
                 (uint)bVar66 * ((uint)bVar10 * auVar80._24_4_ | !bVar10 * uVar141) |
                 !bVar66 * auVar131._24_4_;
            bVar66 = SUB81(uVar67 >> 7,0);
            auVar131._28_4_ =
                 (uint)bVar66 * ((uint)bVar11 * auVar80._28_4_ | !bVar11 * uVar142) |
                 !bVar66 * auVar131._28_4_;
            bVar63 = (~bVar58 | bVar54) & bVar63;
          }
        }
        auVar248._0_4_ = local_840._0_4_ * auVar243._0_4_;
        auVar248._4_4_ = local_840._4_4_ * auVar243._4_4_;
        auVar248._8_4_ = local_840._8_4_ * auVar243._8_4_;
        auVar248._12_4_ = local_840._12_4_ * auVar243._12_4_;
        auVar248._16_4_ = local_840._16_4_ * auVar243._16_4_;
        auVar248._20_4_ = local_840._20_4_ * auVar243._20_4_;
        auVar248._28_36_ = auVar243._28_36_;
        auVar248._24_4_ = local_840._24_4_ * auVar243._24_4_;
        auVar262 = ZEXT3264(local_820);
        auVar71 = vfmadd231ps_fma(auVar248._0_32_,local_820,auVar95);
        auVar248 = ZEXT3264(local_800);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_800,auVar101);
        auVar242._8_4_ = 0x7fffffff;
        auVar242._0_8_ = 0x7fffffff7fffffff;
        auVar242._12_4_ = 0x7fffffff;
        auVar242._16_4_ = 0x7fffffff;
        auVar242._20_4_ = 0x7fffffff;
        auVar242._24_4_ = 0x7fffffff;
        auVar242._28_4_ = 0x7fffffff;
        auVar243 = ZEXT3264(auVar242);
        auVar80 = vandps_avx(ZEXT1632(auVar71),auVar242);
        auVar257 = ZEXT3264(auVar81);
        _local_440 = auVar81;
        auVar239._8_4_ = 0x3e99999a;
        auVar239._0_8_ = 0x3e99999a3e99999a;
        auVar239._12_4_ = 0x3e99999a;
        auVar239._16_4_ = 0x3e99999a;
        auVar239._20_4_ = 0x3e99999a;
        auVar239._24_4_ = 0x3e99999a;
        auVar239._28_4_ = 0x3e99999a;
        uVar15 = vcmpps_avx512vl(auVar80,auVar239,1);
        _local_720 = vmaxps_avx(auVar81,auVar131);
        auVar80 = vminps_avx(local_680,auVar130);
        uVar17 = vcmpps_avx512vl(auVar81,auVar80,2);
        bVar58 = (byte)uVar17 & bVar53;
        uVar16 = vcmpps_avx512vl(_local_720,local_680,2);
        if ((bVar53 & ((byte)uVar16 | (byte)uVar17)) == 0) {
          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar265 = ZEXT3264(auVar80);
          auVar161 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          bVar54 = (byte)uVar15 | ~bVar63;
          auVar47._4_4_ = local_840._4_4_ * auVar255._4_4_;
          auVar47._0_4_ = local_840._0_4_ * auVar255._0_4_;
          auVar47._8_4_ = local_840._8_4_ * auVar255._8_4_;
          auVar47._12_4_ = local_840._12_4_ * auVar255._12_4_;
          auVar47._16_4_ = local_840._16_4_ * auVar255._16_4_;
          auVar47._20_4_ = local_840._20_4_ * auVar255._20_4_;
          auVar47._24_4_ = local_840._24_4_ * auVar255._24_4_;
          auVar47._28_4_ = auVar80._28_4_;
          auVar71 = vfmadd213ps_fma(auVar102,local_820,auVar47);
          auVar71 = vfmadd213ps_fma(auVar94,local_800,ZEXT1632(auVar71));
          auVar80 = vandps_avx(ZEXT1632(auVar71),auVar242);
          uVar15 = vcmpps_avx512vl(auVar80,auVar239,1);
          bVar63 = (byte)uVar15 | ~bVar63;
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          auVar28._8_4_ = 3;
          auVar28._0_8_ = 0x300000003;
          auVar28._12_4_ = 3;
          auVar28._16_4_ = 3;
          auVar28._20_4_ = 3;
          auVar28._24_4_ = 3;
          auVar28._28_4_ = 3;
          auVar80 = vpblendmd_avx512vl(auVar155,auVar28);
          local_660._0_4_ = (uint)(bVar63 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
          bVar66 = (bool)(bVar63 >> 1 & 1);
          local_660._4_4_ = (uint)bVar66 * auVar80._4_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 2 & 1);
          local_660._8_4_ = (uint)bVar66 * auVar80._8_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 3 & 1);
          local_660._12_4_ = (uint)bVar66 * auVar80._12_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 4 & 1);
          local_660._16_4_ = (uint)bVar66 * auVar80._16_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 5 & 1);
          local_660._20_4_ = (uint)bVar66 * auVar80._20_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar63 >> 6 & 1);
          local_660._24_4_ = (uint)bVar66 * auVar80._24_4_ | (uint)!bVar66 * 2;
          local_660._28_4_ = (uint)(bVar63 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
          local_6c0 = vpbroadcastd_avx512vl();
          uVar15 = vpcmpd_avx512vl(local_6c0,local_660,5);
          local_700 = auVar81._0_4_ + (float)local_7e0._0_4_;
          fStack_6fc = auVar81._4_4_ + (float)local_7e0._4_4_;
          fStack_6f8 = auVar81._8_4_ + fStack_7d8;
          fStack_6f4 = auVar81._12_4_ + fStack_7d4;
          fStack_6f0 = auVar81._16_4_ + fStack_7d0;
          fStack_6ec = auVar81._20_4_ + fStack_7cc;
          fStack_6e8 = auVar81._24_4_ + fStack_7c8;
          fStack_6e4 = auVar81._28_4_ + fStack_7c4;
          _local_6a0 = _local_720;
          for (bVar63 = (byte)uVar15 & bVar58; auVar80 = _local_6a0, bVar63 != 0;
              bVar63 = ~bVar60 & bVar63 & (byte)uVar15) {
            auVar156._8_4_ = 0x7f800000;
            auVar156._0_8_ = 0x7f8000007f800000;
            auVar156._12_4_ = 0x7f800000;
            auVar156._16_4_ = 0x7f800000;
            auVar156._20_4_ = 0x7f800000;
            auVar156._24_4_ = 0x7f800000;
            auVar156._28_4_ = 0x7f800000;
            auVar80 = vblendmps_avx512vl(auVar156,auVar81);
            auVar132._0_4_ =
                 (uint)(bVar63 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar66 * auVar80._4_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar66 * auVar80._8_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar66 * auVar80._12_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar66 * auVar80._16_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar66 * auVar80._20_4_ | (uint)!bVar66 * 0x7f800000;
            auVar132._24_4_ =
                 (uint)(bVar63 >> 6) * auVar80._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar80 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar80 = vminps_avx(auVar132,auVar80);
            auVar95 = vshufpd_avx(auVar80,auVar80,5);
            auVar80 = vminps_avx(auVar80,auVar95);
            auVar95 = vpermpd_avx2(auVar80,0x4e);
            auVar80 = vminps_avx(auVar80,auVar95);
            uVar15 = vcmpps_avx512vl(auVar132,auVar80,0);
            bVar55 = (byte)uVar15 & bVar63;
            bVar60 = bVar63;
            if (bVar55 != 0) {
              bVar60 = bVar55;
            }
            iVar18 = 0;
            for (uVar68 = (uint)bVar60; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            bVar60 = '\x01' << ((byte)iVar18 & 0x1f);
            uVar68 = *(uint *)(local_520 + (uint)(iVar18 << 2));
            uVar136 = *(uint *)(local_440 + (uint)(iVar18 << 2));
            fVar244 = auVar13._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar248 = ZEXT1664(auVar248._0_16_);
              auVar255 = ZEXT1664(auVar255._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar262 = ZEXT1664(auVar262._0_16_);
              fVar244 = sqrtf((float)local_9e0._0_4_);
            }
            auVar243 = ZEXT464(uVar136);
            uVar67 = (ulong)bVar60;
            auVar72 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar71 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar69 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar1 = vminps_avx(auVar72,auVar69);
            auVar72 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar69 = vmaxps_avx(auVar71,auVar72);
            auVar211._8_4_ = 0x7fffffff;
            auVar211._0_8_ = 0x7fffffff7fffffff;
            auVar211._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar1,auVar211);
            auVar72 = vandps_avx(auVar69,auVar211);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar249 = auVar71._0_4_ * 1.9073486e-06;
            local_930 = vshufps_avx(auVar69,auVar69,0xff);
            auVar71 = vinsertps_avx(ZEXT416(uVar136),ZEXT416(uVar68),0x10);
            auVar253 = ZEXT1664(auVar71);
            uVar59 = 0;
            while( true ) {
              bVar55 = (byte)uVar67;
              if (uVar59 == 5) break;
              uVar168 = auVar253._0_4_;
              auVar146._4_4_ = uVar168;
              auVar146._0_4_ = uVar168;
              auVar146._8_4_ = uVar168;
              auVar146._12_4_ = uVar168;
              auVar71 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_9d0);
              auVar72 = vmovshdup_avx(auVar253._0_16_);
              fVar233 = auVar72._0_4_;
              fVar210 = 1.0 - fVar233;
              fVar251 = fVar210 * fVar210 * fVar210;
              fVar226 = fVar233 * fVar233 * fVar233;
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                        ZEXT416((uint)fVar226));
              fVar250 = fVar233 * fVar210;
              auVar227 = ZEXT416((uint)fVar210);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar233 * 6.0)),
                                        ZEXT416((uint)(fVar250 * fVar210)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar226),
                                       ZEXT416((uint)fVar251));
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar210 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar250 * fVar233)));
              fVar251 = fVar251 * 0.16666667;
              fVar224 = (auVar69._0_4_ + auVar73._0_4_) * 0.16666667;
              fVar225 = (auVar1._0_4_ + auVar70._0_4_) * 0.16666667;
              fVar226 = fVar226 * 0.16666667;
              auVar186._0_4_ = fVar226 * (float)local_9c0._0_4_;
              auVar186._4_4_ = fVar226 * (float)local_9c0._4_4_;
              auVar186._8_4_ = fVar226 * fStack_9b8;
              auVar186._12_4_ = fVar226 * fStack_9b4;
              auVar228._4_4_ = fVar225;
              auVar228._0_4_ = fVar225;
              auVar228._8_4_ = fVar225;
              auVar228._12_4_ = fVar225;
              auVar69 = vfmadd132ps_fma(auVar228,auVar186,local_980._0_16_);
              auVar187._4_4_ = fVar224;
              auVar187._0_4_ = fVar224;
              auVar187._8_4_ = fVar224;
              auVar187._12_4_ = fVar224;
              auVar69 = vfmadd132ps_fma(auVar187,auVar69,local_9a0._0_16_);
              auVar169._4_4_ = fVar251;
              auVar169._0_4_ = fVar251;
              auVar169._8_4_ = fVar251;
              auVar169._12_4_ = fVar251;
              auVar69 = vfmadd132ps_fma(auVar169,auVar69,local_960._0_16_);
              local_860._0_16_ = auVar69;
              auVar69 = vsubps_avx(auVar71,auVar69);
              auVar71 = vdpps_avx(auVar69,auVar69,0x7f);
              local_a00._0_16_ = auVar71;
              local_7c0 = auVar253;
              if (auVar71._0_4_ < 0.0) {
                auVar253._0_4_ = sqrtf(auVar71._0_4_);
                auVar253._4_60_ = extraout_var;
                auVar71 = auVar253._0_16_;
                uVar67 = extraout_RAX;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
              }
              local_880._4_4_ = fVar210;
              local_880._0_4_ = fVar210;
              fStack_878 = fVar210;
              fStack_874 = fVar210;
              auVar73 = vfnmsub213ss_fma(auVar72,auVar72,ZEXT416((uint)(fVar250 * 4.0)));
              auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * 4.0)),auVar227,auVar227);
              fVar250 = fVar210 * -fVar210 * 0.5;
              fVar251 = auVar73._0_4_ * 0.5;
              fVar224 = auVar1._0_4_ * 0.5;
              fVar225 = fVar233 * fVar233 * 0.5;
              auVar212._0_4_ = fVar225 * (float)local_9c0._0_4_;
              auVar212._4_4_ = fVar225 * (float)local_9c0._4_4_;
              auVar212._8_4_ = fVar225 * fStack_9b8;
              auVar212._12_4_ = fVar225 * fStack_9b4;
              auVar170._4_4_ = fVar224;
              auVar170._0_4_ = fVar224;
              auVar170._8_4_ = fVar224;
              auVar170._12_4_ = fVar224;
              auVar1 = vfmadd132ps_fma(auVar170,auVar212,local_980._0_16_);
              auVar188._4_4_ = fVar251;
              auVar188._0_4_ = fVar251;
              auVar188._8_4_ = fVar251;
              auVar188._12_4_ = fVar251;
              auVar1 = vfmadd132ps_fma(auVar188,auVar1,local_9a0._0_16_);
              auVar258._4_4_ = fVar250;
              auVar258._0_4_ = fVar250;
              auVar258._8_4_ = fVar250;
              auVar258._12_4_ = fVar250;
              auVar1 = vfmadd132ps_fma(auVar258,auVar1,local_960._0_16_);
              local_8a0._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
              auVar48._12_4_ = 0;
              auVar48._0_12_ = ZEXT812(0);
              fVar250 = local_8a0._0_4_;
              auVar73 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar250));
              fVar251 = auVar73._0_4_;
              local_8c0._0_16_ = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar250));
              auVar73 = vfnmadd213ss_fma(local_8c0._0_16_,local_8a0._0_16_,ZEXT416(0x40000000));
              local_8e0._0_4_ = auVar73._0_4_;
              uVar68 = auVar71._0_4_;
              if (fVar250 < -fVar250) {
                fVar224 = sqrtf(fVar250);
                auVar71 = ZEXT416(uVar68);
                uVar67 = extraout_RAX_00;
              }
              else {
                auVar73 = vsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                fVar224 = auVar73._0_4_;
              }
              fVar250 = fVar251 * 1.5 + fVar250 * -0.5 * fVar251 * fVar251 * fVar251;
              auVar147._0_4_ = auVar1._0_4_ * fVar250;
              auVar147._4_4_ = auVar1._4_4_ * fVar250;
              auVar147._8_4_ = auVar1._8_4_ * fVar250;
              auVar147._12_4_ = auVar1._12_4_ * fVar250;
              auVar73 = vdpps_avx(auVar69,auVar147,0x7f);
              fVar226 = auVar71._0_4_;
              fVar251 = auVar73._0_4_;
              auVar148._0_4_ = fVar251 * fVar251;
              auVar148._4_4_ = auVar73._4_4_ * auVar73._4_4_;
              auVar148._8_4_ = auVar73._8_4_ * auVar73._8_4_;
              auVar148._12_4_ = auVar73._12_4_ * auVar73._12_4_;
              auVar70 = vsubps_avx(local_a00._0_16_,auVar148);
              fVar225 = auVar70._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar225;
              auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar75 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
              if (fVar225 < 0.0) {
                local_8f0._0_4_ = fVar224;
                local_910._0_4_ = auVar75._0_4_;
                local_920._4_4_ = fVar250;
                local_920._0_4_ = fVar250;
                fStack_918 = fVar250;
                fStack_914 = fVar250;
                local_900 = auVar74;
                fVar225 = sqrtf(fVar225);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416((uint)local_910._0_4_);
                auVar71 = ZEXT416(uVar68);
                uVar67 = extraout_RAX_01;
                auVar74 = local_900;
                fVar250 = (float)local_920._0_4_;
                fVar210 = (float)local_920._4_4_;
                fVar233 = fStack_918;
                fVar263 = fStack_914;
                fVar224 = (float)local_8f0._0_4_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
                fVar225 = auVar70._0_4_;
                fVar210 = fVar250;
                fVar233 = fVar250;
                fVar263 = fVar250;
              }
              auVar262 = ZEXT1664(auVar1);
              auVar257 = ZEXT1664(local_a00._0_16_);
              auVar255 = ZEXT1664(auVar69);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar227,auVar72);
              auVar227 = vfmadd213ss_fma(auVar72,SUB6416(ZEXT464(0xc0000000),0),auVar227);
              auVar79 = local_7c0._0_16_;
              auVar72 = vshufps_avx(auVar79,auVar79,0x55);
              auVar189._0_4_ = auVar72._0_4_ * (float)local_9c0._0_4_;
              auVar189._4_4_ = auVar72._4_4_ * (float)local_9c0._4_4_;
              auVar189._8_4_ = auVar72._8_4_ * fStack_9b8;
              auVar189._12_4_ = auVar72._12_4_ * fStack_9b4;
              auVar213._0_4_ = auVar227._0_4_;
              auVar213._4_4_ = auVar213._0_4_;
              auVar213._8_4_ = auVar213._0_4_;
              auVar213._12_4_ = auVar213._0_4_;
              auVar72 = vfmadd132ps_fma(auVar213,auVar189,local_980._0_16_);
              auVar172._0_4_ = auVar70._0_4_;
              auVar172._4_4_ = auVar172._0_4_;
              auVar172._8_4_ = auVar172._0_4_;
              auVar172._12_4_ = auVar172._0_4_;
              auVar72 = vfmadd132ps_fma(auVar172,auVar72,local_9a0._0_16_);
              auVar72 = vfmadd132ps_fma(_local_880,auVar72,local_960._0_16_);
              auVar173._0_4_ = auVar72._0_4_ * (float)local_8a0._0_4_;
              auVar173._4_4_ = auVar72._4_4_ * (float)local_8a0._0_4_;
              auVar173._8_4_ = auVar72._8_4_ * (float)local_8a0._0_4_;
              auVar173._12_4_ = auVar72._12_4_ * (float)local_8a0._0_4_;
              auVar72 = vdpps_avx(auVar1,auVar72,0x7f);
              fVar185 = auVar72._0_4_;
              auVar190._0_4_ = auVar1._0_4_ * fVar185;
              auVar190._4_4_ = auVar1._4_4_ * fVar185;
              auVar190._8_4_ = auVar1._8_4_ * fVar185;
              auVar190._12_4_ = auVar1._12_4_ * fVar185;
              auVar72 = vsubps_avx(auVar173,auVar190);
              fVar185 = (float)local_8e0._0_4_ * (float)local_8c0._0_4_;
              auVar227 = vmaxss_avx(ZEXT416((uint)fVar249),
                                    ZEXT416((uint)(local_7c0._0_4_ * fVar244 * 1.9073486e-06)));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar1,auVar19);
              auVar191._0_4_ = fVar250 * auVar72._0_4_ * fVar185;
              auVar191._4_4_ = fVar210 * auVar72._4_4_ * fVar185;
              auVar191._8_4_ = fVar233 * auVar72._8_4_ * fVar185;
              auVar191._12_4_ = fVar263 * auVar72._12_4_ * fVar185;
              auVar72 = vdpps_avx(auVar77,auVar147,0x7f);
              auVar70 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar249),auVar227);
              auVar71 = vdpps_avx(auVar69,auVar191,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar226 + 1.0)),
                                        ZEXT416((uint)(fVar249 / fVar224)),auVar70);
              fVar250 = auVar72._0_4_ + auVar71._0_4_;
              auVar71 = vdpps_avx(local_9d0,auVar147,0x7f);
              auVar72 = vdpps_avx(auVar69,auVar77,0x7f);
              auVar70 = vmulss_avx512f(auVar76,auVar74);
              auVar76 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar70._0_4_ *
                                                             auVar74._0_4_ * auVar74._0_4_)));
              auVar70 = vdpps_avx(auVar69,local_9d0,0x7f);
              auVar75 = vfnmadd231ss_fma(auVar72,auVar73,ZEXT416((uint)fVar250));
              auVar70 = vfnmadd231ss_fma(auVar70,auVar73,auVar71);
              auVar72 = vpermilps_avx(local_860._0_16_,0xff);
              fVar225 = fVar225 - auVar72._0_4_;
              auVar74 = vshufps_avx(auVar1,auVar1,0xff);
              auVar72 = vfmsub213ss_fma(auVar75,auVar76,auVar74);
              auVar245._8_4_ = 0x80000000;
              auVar245._0_8_ = 0x8000000080000000;
              auVar245._12_4_ = 0x80000000;
              auVar248 = ZEXT1664(auVar245);
              auVar240._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar240._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar240._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar243 = ZEXT1664(auVar240);
              auVar70 = ZEXT416((uint)(auVar70._0_4_ * auVar76._0_4_));
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)),
                                        ZEXT416((uint)fVar250),auVar70);
              auVar72 = vinsertps_avx(auVar240,auVar70,0x1c);
              auVar234._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar70 = vinsertps_avx(ZEXT416((uint)fVar250),auVar234,0x10);
              auVar214._0_4_ = auVar75._0_4_;
              auVar214._4_4_ = auVar214._0_4_;
              auVar214._8_4_ = auVar214._0_4_;
              auVar214._12_4_ = auVar214._0_4_;
              auVar71 = vdivps_avx(auVar72,auVar214);
              auVar72 = vdivps_avx(auVar70,auVar214);
              auVar215._0_4_ = fVar251 * auVar71._0_4_ + fVar225 * auVar72._0_4_;
              auVar215._4_4_ = fVar251 * auVar71._4_4_ + fVar225 * auVar72._4_4_;
              auVar215._8_4_ = fVar251 * auVar71._8_4_ + fVar225 * auVar72._8_4_;
              auVar215._12_4_ = fVar251 * auVar71._12_4_ + fVar225 * auVar72._12_4_;
              auVar71 = vsubps_avx(auVar79,auVar215);
              auVar253 = ZEXT1664(auVar71);
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(auVar73,auVar20);
              if (auVar72._0_4_ < auVar78._0_4_) {
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar227._0_4_)),local_930,
                                          ZEXT416(0x36000000));
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar225),auVar21);
                if (auVar73._0_4_ < auVar72._0_4_) {
                  bVar66 = uVar59 < 5;
                  fVar244 = auVar71._0_4_ + (float)local_940._0_4_;
                  if ((fVar143 <= fVar244) &&
                     (fVar249 = *(float *)(ray + k * 4 + 0x200), fVar244 <= fVar249)) {
                    auVar72 = vmovshdup_avx(auVar71);
                    bVar55 = 0;
                    if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_019e30e3;
                    auVar216._0_12_ = ZEXT812(0);
                    auVar216._12_4_ = 0;
                    auVar192._4_8_ = auVar216._4_8_;
                    auVar192._0_4_ = local_a00._0_4_;
                    auVar192._12_4_ = 0;
                    auVar72 = vrsqrt14ss_avx512f(auVar216,auVar192);
                    fVar250 = auVar72._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar55 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_019e30e3;
                      fVar250 = fVar250 * 1.5 + local_a00._0_4_ * -0.5 * fVar250 * fVar250 * fVar250
                      ;
                      auVar193._0_4_ = auVar69._0_4_ * fVar250;
                      auVar193._4_4_ = auVar69._4_4_ * fVar250;
                      auVar193._8_4_ = auVar69._8_4_ * fVar250;
                      auVar193._12_4_ = auVar69._12_4_ * fVar250;
                      auVar227 = vfmadd213ps_fma(auVar74,auVar193,auVar1);
                      auVar72 = vshufps_avx(auVar193,auVar193,0xc9);
                      auVar73 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar194._0_4_ = auVar193._0_4_ * auVar73._0_4_;
                      auVar194._4_4_ = auVar193._4_4_ * auVar73._4_4_;
                      auVar194._8_4_ = auVar193._8_4_ * auVar73._8_4_;
                      auVar194._12_4_ = auVar193._12_4_ * auVar73._12_4_;
                      auVar70 = vfmsub231ps_fma(auVar194,auVar1,auVar72);
                      auVar72 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar73 = vshufps_avx(auVar227,auVar227,0xc9);
                      auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                      auVar149._0_4_ = auVar227._0_4_ * auVar70._0_4_;
                      auVar149._4_4_ = auVar227._4_4_ * auVar70._4_4_;
                      auVar149._8_4_ = auVar227._8_4_ * auVar70._8_4_;
                      auVar149._12_4_ = auVar227._12_4_ * auVar70._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar149,auVar72,auVar73);
                      auVar161 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar161,auVar253);
                      auVar161 = vpermps_avx512f(auVar161,ZEXT1664(auVar72));
                      auVar265 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar265,ZEXT1664(auVar72));
                      local_380 = vbroadcastss_avx512f(auVar72);
                      local_400[0] = (RTCHitN)auVar161[0];
                      local_400[1] = (RTCHitN)auVar161[1];
                      local_400[2] = (RTCHitN)auVar161[2];
                      local_400[3] = (RTCHitN)auVar161[3];
                      local_400[4] = (RTCHitN)auVar161[4];
                      local_400[5] = (RTCHitN)auVar161[5];
                      local_400[6] = (RTCHitN)auVar161[6];
                      local_400[7] = (RTCHitN)auVar161[7];
                      local_400[8] = (RTCHitN)auVar161[8];
                      local_400[9] = (RTCHitN)auVar161[9];
                      local_400[10] = (RTCHitN)auVar161[10];
                      local_400[0xb] = (RTCHitN)auVar161[0xb];
                      local_400[0xc] = (RTCHitN)auVar161[0xc];
                      local_400[0xd] = (RTCHitN)auVar161[0xd];
                      local_400[0xe] = (RTCHitN)auVar161[0xe];
                      local_400[0xf] = (RTCHitN)auVar161[0xf];
                      local_400[0x10] = (RTCHitN)auVar161[0x10];
                      local_400[0x11] = (RTCHitN)auVar161[0x11];
                      local_400[0x12] = (RTCHitN)auVar161[0x12];
                      local_400[0x13] = (RTCHitN)auVar161[0x13];
                      local_400[0x14] = (RTCHitN)auVar161[0x14];
                      local_400[0x15] = (RTCHitN)auVar161[0x15];
                      local_400[0x16] = (RTCHitN)auVar161[0x16];
                      local_400[0x17] = (RTCHitN)auVar161[0x17];
                      local_400[0x18] = (RTCHitN)auVar161[0x18];
                      local_400[0x19] = (RTCHitN)auVar161[0x19];
                      local_400[0x1a] = (RTCHitN)auVar161[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar161[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar161[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar161[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar161[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar161[0x1f];
                      local_400[0x20] = (RTCHitN)auVar161[0x20];
                      local_400[0x21] = (RTCHitN)auVar161[0x21];
                      local_400[0x22] = (RTCHitN)auVar161[0x22];
                      local_400[0x23] = (RTCHitN)auVar161[0x23];
                      local_400[0x24] = (RTCHitN)auVar161[0x24];
                      local_400[0x25] = (RTCHitN)auVar161[0x25];
                      local_400[0x26] = (RTCHitN)auVar161[0x26];
                      local_400[0x27] = (RTCHitN)auVar161[0x27];
                      local_400[0x28] = (RTCHitN)auVar161[0x28];
                      local_400[0x29] = (RTCHitN)auVar161[0x29];
                      local_400[0x2a] = (RTCHitN)auVar161[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar161[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar161[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar161[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar161[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar161[0x2f];
                      local_400[0x30] = (RTCHitN)auVar161[0x30];
                      local_400[0x31] = (RTCHitN)auVar161[0x31];
                      local_400[0x32] = (RTCHitN)auVar161[0x32];
                      local_400[0x33] = (RTCHitN)auVar161[0x33];
                      local_400[0x34] = (RTCHitN)auVar161[0x34];
                      local_400[0x35] = (RTCHitN)auVar161[0x35];
                      local_400[0x36] = (RTCHitN)auVar161[0x36];
                      local_400[0x37] = (RTCHitN)auVar161[0x37];
                      local_400[0x38] = (RTCHitN)auVar161[0x38];
                      local_400[0x39] = (RTCHitN)auVar161[0x39];
                      local_400[0x3a] = (RTCHitN)auVar161[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar161[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar161[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar161[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar161[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar161[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar161 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar161);
                      vpcmpeqd_avx2(auVar161._0_32_,auVar161._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar244;
                      auVar161 = vmovdqa64_avx512f(local_500);
                      local_780 = vmovdqa64_avx512f(auVar161);
                      local_a30.valid = (int *)local_780;
                      local_a30.geometryUserPtr = pGVar3->userPtr;
                      local_a30.context = context->user;
                      local_a30.hit = local_400;
                      local_a30.N = 0x10;
                      local_a30.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar243 = ZEXT1664(auVar240);
                        auVar248 = ZEXT1664(auVar245);
                        auVar253 = ZEXT1664(auVar71);
                        auVar255 = ZEXT1664(auVar69);
                        auVar257 = ZEXT1664(local_a00._0_16_);
                        auVar262 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_a30);
                        auVar161 = vmovdqa64_avx512f(local_780);
                      }
                      uVar15 = vptestmd_avx512f(auVar161,auVar161);
                      if ((short)uVar15 != 0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar243 = ZEXT1664(auVar243._0_16_);
                          auVar248 = ZEXT1664(auVar248._0_16_);
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          auVar255 = ZEXT1664(auVar255._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          (*p_Var4)(&local_a30);
                          auVar161 = vmovdqa64_avx512f(local_780);
                        }
                        uVar67 = vptestmd_avx512f(auVar161,auVar161);
                        auVar161 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar67 & 1);
                        auVar135._0_4_ =
                             (uint)bVar5 * auVar161._0_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x200);
                        bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
                        auVar135._4_4_ =
                             (uint)bVar5 * auVar161._4_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x204);
                        bVar5 = (bool)((byte)(uVar67 >> 2) & 1);
                        auVar135._8_4_ =
                             (uint)bVar5 * auVar161._8_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x208);
                        bVar5 = (bool)((byte)(uVar67 >> 3) & 1);
                        auVar135._12_4_ =
                             (uint)bVar5 * auVar161._12_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x20c);
                        bVar5 = (bool)((byte)(uVar67 >> 4) & 1);
                        auVar135._16_4_ =
                             (uint)bVar5 * auVar161._16_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x210);
                        bVar5 = (bool)((byte)(uVar67 >> 5) & 1);
                        auVar135._20_4_ =
                             (uint)bVar5 * auVar161._20_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x214);
                        bVar5 = (bool)((byte)(uVar67 >> 6) & 1);
                        auVar135._24_4_ =
                             (uint)bVar5 * auVar161._24_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x218);
                        bVar5 = (bool)((byte)(uVar67 >> 7) & 1);
                        auVar135._28_4_ =
                             (uint)bVar5 * auVar161._28_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x21c);
                        bVar5 = (bool)((byte)(uVar67 >> 8) & 1);
                        auVar135._32_4_ =
                             (uint)bVar5 * auVar161._32_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x220);
                        bVar5 = (bool)((byte)(uVar67 >> 9) & 1);
                        auVar135._36_4_ =
                             (uint)bVar5 * auVar161._36_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x224);
                        bVar5 = (bool)((byte)(uVar67 >> 10) & 1);
                        auVar135._40_4_ =
                             (uint)bVar5 * auVar161._40_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x228);
                        bVar5 = (bool)((byte)(uVar67 >> 0xb) & 1);
                        auVar135._44_4_ =
                             (uint)bVar5 * auVar161._44_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x22c);
                        bVar5 = (bool)((byte)(uVar67 >> 0xc) & 1);
                        auVar135._48_4_ =
                             (uint)bVar5 * auVar161._48_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x230);
                        bVar5 = (bool)((byte)(uVar67 >> 0xd) & 1);
                        auVar135._52_4_ =
                             (uint)bVar5 * auVar161._52_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x234);
                        bVar5 = (bool)((byte)(uVar67 >> 0xe) & 1);
                        auVar135._56_4_ =
                             (uint)bVar5 * auVar161._56_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x238);
                        bVar5 = SUB81(uVar67 >> 0xf,0);
                        auVar135._60_4_ =
                             (uint)bVar5 * auVar161._60_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x23c);
                        *(undefined1 (*) [64])(local_a30.ray + 0x200) = auVar135;
                        bVar55 = 1;
                        if ((short)uVar67 != 0) goto LAB_019e30e3;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar249;
                      bVar55 = 0;
                      goto LAB_019e30e3;
                    }
                  }
                  bVar55 = 0;
                  goto LAB_019e30e3;
                }
              }
              uVar59 = uVar59 + 1;
            }
            bVar66 = false;
LAB_019e30e3:
            bVar65 = bVar65 | bVar66 & bVar55;
            uVar168 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar236._4_4_ = uVar168;
            auVar236._0_4_ = uVar168;
            auVar236._8_4_ = uVar168;
            auVar236._12_4_ = uVar168;
            auVar236._16_4_ = uVar168;
            auVar236._20_4_ = uVar168;
            auVar236._24_4_ = uVar168;
            auVar236._28_4_ = uVar168;
            auVar161 = ZEXT3264(auVar236);
            auVar50._4_4_ = fStack_6fc;
            auVar50._0_4_ = local_700;
            auVar50._8_4_ = fStack_6f8;
            auVar50._12_4_ = fStack_6f4;
            auVar50._16_4_ = fStack_6f0;
            auVar50._20_4_ = fStack_6ec;
            auVar50._24_4_ = fStack_6e8;
            auVar50._28_4_ = fStack_6e4;
            uVar15 = vcmpps_avx512vl(auVar236,auVar50,0xd);
          }
          auVar157._0_4_ = (float)local_7e0._0_4_ + (float)local_720._0_4_;
          auVar157._4_4_ = (float)local_7e0._4_4_ + (float)local_720._4_4_;
          auVar157._8_4_ = fStack_7d8 + fStack_718;
          auVar157._12_4_ = fStack_7d4 + fStack_714;
          auVar157._16_4_ = fStack_7d0 + fStack_710;
          auVar157._20_4_ = fStack_7cc + fStack_70c;
          auVar157._24_4_ = fStack_7c8 + fStack_708;
          auVar157._28_4_ = fStack_7c4 + fStack_704;
          uVar168 = auVar161._0_4_;
          auVar180._4_4_ = uVar168;
          auVar180._0_4_ = uVar168;
          auVar180._8_4_ = uVar168;
          auVar180._12_4_ = uVar168;
          auVar180._16_4_ = uVar168;
          auVar180._20_4_ = uVar168;
          auVar180._24_4_ = uVar168;
          auVar180._28_4_ = uVar168;
          uVar15 = vcmpps_avx512vl(auVar157,auVar180,2);
          auVar158._8_4_ = 2;
          auVar158._0_8_ = 0x200000002;
          auVar158._12_4_ = 2;
          auVar158._16_4_ = 2;
          auVar158._20_4_ = 2;
          auVar158._24_4_ = 2;
          auVar158._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar81 = vpblendmd_avx512vl(auVar158,auVar29);
          local_720._0_4_ = (uint)(bVar54 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar54 & 1) * 2;
          bVar66 = (bool)(bVar54 >> 1 & 1);
          local_720._4_4_ = (uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * 2;
          bVar66 = (bool)(bVar54 >> 2 & 1);
          fStack_718 = (float)((uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * 2);
          bVar66 = (bool)(bVar54 >> 3 & 1);
          fStack_714 = (float)((uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * 2);
          bVar66 = (bool)(bVar54 >> 4 & 1);
          fStack_710 = (float)((uint)bVar66 * auVar81._16_4_ | (uint)!bVar66 * 2);
          bVar66 = (bool)(bVar54 >> 5 & 1);
          fStack_70c = (float)((uint)bVar66 * auVar81._20_4_ | (uint)!bVar66 * 2);
          bVar66 = (bool)(bVar54 >> 6 & 1);
          fStack_708 = (float)((uint)bVar66 * auVar81._24_4_ | (uint)!bVar66 * 2);
          fStack_704 = (float)((uint)(bVar54 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar54 >> 7) * 2
                              );
          bVar53 = (byte)uVar16 & bVar53 & (byte)uVar15;
          uVar15 = vpcmpd_avx512vl(_local_720,local_6c0,2);
          local_700 = (float)local_7e0._0_4_ + (float)local_6a0._0_4_;
          fStack_6fc = (float)local_7e0._4_4_ + (float)local_6a0._4_4_;
          fStack_6f8 = fStack_7d8 + fStack_698;
          fStack_6f4 = fStack_7d4 + fStack_694;
          fStack_6f0 = fStack_7d0 + fStack_690;
          fStack_6ec = fStack_7cc + fStack_68c;
          fStack_6e8 = fStack_7c8 + fStack_688;
          fStack_6e4 = fStack_7c4 + fStack_684;
          for (bVar63 = (byte)uVar15 & bVar53; bVar63 != 0; bVar63 = ~bVar54 & bVar63 & (byte)uVar15
              ) {
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar81 = vblendmps_avx512vl(auVar159,auVar80);
            auVar133._0_4_ =
                 (uint)(bVar63 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar66 * auVar81._16_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar63 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar66 * auVar81._20_4_ | (uint)!bVar66 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar63 >> 6) * auVar81._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar81 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar81 = vminps_avx(auVar133,auVar81);
            auVar95 = vshufpd_avx(auVar81,auVar81,5);
            auVar81 = vminps_avx(auVar81,auVar95);
            auVar95 = vpermpd_avx2(auVar81,0x4e);
            auVar81 = vminps_avx(auVar81,auVar95);
            uVar15 = vcmpps_avx512vl(auVar133,auVar81,0);
            bVar60 = (byte)uVar15 & bVar63;
            bVar54 = bVar63;
            if (bVar60 != 0) {
              bVar54 = bVar60;
            }
            iVar18 = 0;
            for (uVar68 = (uint)bVar54; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            bVar54 = '\x01' << ((byte)iVar18 & 0x1f);
            uVar68 = *(uint *)(local_540 + (uint)(iVar18 << 2));
            uVar136 = *(uint *)(local_680 + (uint)(iVar18 << 2));
            fVar244 = auVar12._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar248 = ZEXT1664(auVar248._0_16_);
              auVar255 = ZEXT1664(auVar255._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar262 = ZEXT1664(auVar262._0_16_);
              fVar244 = sqrtf((float)local_9e0._0_4_);
            }
            auVar243 = ZEXT464(uVar136);
            uVar67 = (ulong)bVar54;
            auVar72 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar71 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar69 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar1 = vminps_avx(auVar72,auVar69);
            auVar72 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar69 = vmaxps_avx(auVar71,auVar72);
            auVar217._8_4_ = 0x7fffffff;
            auVar217._0_8_ = 0x7fffffff7fffffff;
            auVar217._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar1,auVar217);
            auVar72 = vandps_avx(auVar69,auVar217);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar249 = auVar71._0_4_ * 1.9073486e-06;
            local_930 = vshufps_avx(auVar69,auVar69,0xff);
            auVar71 = vinsertps_avx(ZEXT416(uVar136),ZEXT416(uVar68),0x10);
            auVar253 = ZEXT1664(auVar71);
            uVar59 = 0;
            while( true ) {
              bVar60 = (byte)uVar67;
              if (uVar59 == 5) break;
              uVar168 = auVar253._0_4_;
              auVar150._4_4_ = uVar168;
              auVar150._0_4_ = uVar168;
              auVar150._8_4_ = uVar168;
              auVar150._12_4_ = uVar168;
              auVar71 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_9d0);
              auVar72 = vmovshdup_avx(auVar253._0_16_);
              fVar233 = auVar72._0_4_;
              fVar210 = 1.0 - fVar233;
              fVar251 = fVar210 * fVar210 * fVar210;
              fVar226 = fVar233 * fVar233 * fVar233;
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                        ZEXT416((uint)fVar226));
              fVar250 = fVar233 * fVar210;
              auVar227 = ZEXT416((uint)fVar210);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar233 * 6.0)),
                                        ZEXT416((uint)(fVar250 * fVar210)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar226),
                                       ZEXT416((uint)fVar251));
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar210 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar250 * fVar233)));
              fVar251 = fVar251 * 0.16666667;
              fVar224 = (auVar69._0_4_ + auVar73._0_4_) * 0.16666667;
              fVar225 = (auVar1._0_4_ + auVar70._0_4_) * 0.16666667;
              fVar226 = fVar226 * 0.16666667;
              auVar195._0_4_ = fVar226 * (float)local_9c0._0_4_;
              auVar195._4_4_ = fVar226 * (float)local_9c0._4_4_;
              auVar195._8_4_ = fVar226 * fStack_9b8;
              auVar195._12_4_ = fVar226 * fStack_9b4;
              auVar229._4_4_ = fVar225;
              auVar229._0_4_ = fVar225;
              auVar229._8_4_ = fVar225;
              auVar229._12_4_ = fVar225;
              auVar69 = vfmadd132ps_fma(auVar229,auVar195,local_980._0_16_);
              auVar196._4_4_ = fVar224;
              auVar196._0_4_ = fVar224;
              auVar196._8_4_ = fVar224;
              auVar196._12_4_ = fVar224;
              auVar69 = vfmadd132ps_fma(auVar196,auVar69,local_9a0._0_16_);
              auVar174._4_4_ = fVar251;
              auVar174._0_4_ = fVar251;
              auVar174._8_4_ = fVar251;
              auVar174._12_4_ = fVar251;
              auVar69 = vfmadd132ps_fma(auVar174,auVar69,local_960._0_16_);
              local_860._0_16_ = auVar69;
              auVar69 = vsubps_avx(auVar71,auVar69);
              auVar71 = vdpps_avx(auVar69,auVar69,0x7f);
              local_a00._0_16_ = auVar71;
              local_7c0 = auVar253;
              if (auVar71._0_4_ < 0.0) {
                auVar243._0_4_ = sqrtf(auVar71._0_4_);
                auVar243._4_60_ = extraout_var_00;
                auVar71 = auVar243._0_16_;
                uVar67 = extraout_RAX_02;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
              }
              local_880._4_4_ = fVar210;
              local_880._0_4_ = fVar210;
              fStack_878 = fVar210;
              fStack_874 = fVar210;
              auVar73 = vfnmsub213ss_fma(auVar72,auVar72,ZEXT416((uint)(fVar250 * 4.0)));
              auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * 4.0)),auVar227,auVar227);
              fVar250 = fVar210 * -fVar210 * 0.5;
              fVar251 = auVar73._0_4_ * 0.5;
              fVar224 = auVar1._0_4_ * 0.5;
              fVar225 = fVar233 * fVar233 * 0.5;
              auVar218._0_4_ = fVar225 * (float)local_9c0._0_4_;
              auVar218._4_4_ = fVar225 * (float)local_9c0._4_4_;
              auVar218._8_4_ = fVar225 * fStack_9b8;
              auVar218._12_4_ = fVar225 * fStack_9b4;
              auVar175._4_4_ = fVar224;
              auVar175._0_4_ = fVar224;
              auVar175._8_4_ = fVar224;
              auVar175._12_4_ = fVar224;
              auVar1 = vfmadd132ps_fma(auVar175,auVar218,local_980._0_16_);
              auVar197._4_4_ = fVar251;
              auVar197._0_4_ = fVar251;
              auVar197._8_4_ = fVar251;
              auVar197._12_4_ = fVar251;
              auVar1 = vfmadd132ps_fma(auVar197,auVar1,local_9a0._0_16_);
              auVar259._4_4_ = fVar250;
              auVar259._0_4_ = fVar250;
              auVar259._8_4_ = fVar250;
              auVar259._12_4_ = fVar250;
              auVar1 = vfmadd132ps_fma(auVar259,auVar1,local_960._0_16_);
              local_8a0._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
              auVar49._12_4_ = 0;
              auVar49._0_12_ = ZEXT812(0);
              fVar250 = local_8a0._0_4_;
              auVar73 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar250));
              fVar251 = auVar73._0_4_;
              local_8c0._0_16_ = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar250));
              auVar73 = vfnmadd213ss_fma(local_8c0._0_16_,local_8a0._0_16_,ZEXT416(0x40000000));
              local_8e0._0_4_ = auVar73._0_4_;
              uVar68 = auVar71._0_4_;
              if (fVar250 < -fVar250) {
                fVar224 = sqrtf(fVar250);
                auVar71 = ZEXT416(uVar68);
                uVar67 = extraout_RAX_03;
              }
              else {
                auVar73 = vsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                fVar224 = auVar73._0_4_;
              }
              auVar76 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar251 * 1.5 +
                                                 fVar250 * -0.5 * fVar251 * fVar251 * fVar251)));
              auVar75 = vmulps_avx512vl(auVar1,auVar76);
              auVar73 = vdpps_avx(auVar69,auVar75,0x7f);
              fVar225 = auVar71._0_4_;
              fVar250 = auVar73._0_4_;
              auVar151._0_4_ = fVar250 * fVar250;
              auVar151._4_4_ = auVar73._4_4_ * auVar73._4_4_;
              auVar151._8_4_ = auVar73._8_4_ * auVar73._8_4_;
              auVar151._12_4_ = auVar73._12_4_ * auVar73._12_4_;
              auVar70 = vsubps_avx(local_a00._0_16_,auVar151);
              fVar251 = auVar70._0_4_;
              auVar176._4_12_ = ZEXT812(0) << 0x20;
              auVar176._0_4_ = fVar251;
              auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
              auVar78 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              auVar77 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
              if (fVar251 < 0.0) {
                local_900._0_4_ = auVar78._0_4_;
                _local_920 = auVar76;
                local_910 = auVar75;
                local_8f0 = auVar74;
                fVar251 = sqrtf(fVar251);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar78 = ZEXT416((uint)local_900._0_4_);
                auVar71 = ZEXT416(uVar68);
                uVar67 = extraout_RAX_04;
                auVar74 = local_8f0;
                auVar75 = local_910;
                auVar76 = _local_920;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
                fVar251 = auVar70._0_4_;
              }
              auVar262 = ZEXT1664(auVar1);
              auVar257 = ZEXT1664(local_a00._0_16_);
              auVar255 = ZEXT1664(auVar69);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar227,auVar72);
              auVar227 = vfmadd213ss_fma(auVar72,SUB6416(ZEXT464(0xc0000000),0),auVar227);
              auVar252 = local_7c0._0_16_;
              auVar72 = vshufps_avx(auVar252,auVar252,0x55);
              auVar198._0_4_ = auVar72._0_4_ * (float)local_9c0._0_4_;
              auVar198._4_4_ = auVar72._4_4_ * (float)local_9c0._4_4_;
              auVar198._8_4_ = auVar72._8_4_ * fStack_9b8;
              auVar198._12_4_ = auVar72._12_4_ * fStack_9b4;
              auVar219._0_4_ = auVar227._0_4_;
              auVar219._4_4_ = auVar219._0_4_;
              auVar219._8_4_ = auVar219._0_4_;
              auVar219._12_4_ = auVar219._0_4_;
              auVar72 = vfmadd132ps_fma(auVar219,auVar198,local_980._0_16_);
              auVar177._0_4_ = auVar70._0_4_;
              auVar177._4_4_ = auVar177._0_4_;
              auVar177._8_4_ = auVar177._0_4_;
              auVar177._12_4_ = auVar177._0_4_;
              auVar72 = vfmadd132ps_fma(auVar177,auVar72,local_9a0._0_16_);
              auVar72 = vfmadd132ps_fma(_local_880,auVar72,local_960._0_16_);
              auVar178._0_4_ = auVar72._0_4_ * (float)local_8a0._0_4_;
              auVar178._4_4_ = auVar72._4_4_ * (float)local_8a0._0_4_;
              auVar178._8_4_ = auVar72._8_4_ * (float)local_8a0._0_4_;
              auVar178._12_4_ = auVar72._12_4_ * (float)local_8a0._0_4_;
              auVar72 = vdpps_avx(auVar1,auVar72,0x7f);
              fVar226 = auVar72._0_4_;
              auVar199._0_4_ = auVar1._0_4_ * fVar226;
              auVar199._4_4_ = auVar1._4_4_ * fVar226;
              auVar199._8_4_ = auVar1._8_4_ * fVar226;
              auVar199._12_4_ = auVar1._12_4_ * fVar226;
              auVar72 = vsubps_avx(auVar178,auVar199);
              fVar226 = (float)local_8e0._0_4_ * (float)local_8c0._0_4_;
              auVar227 = vmaxss_avx(ZEXT416((uint)fVar249),
                                    ZEXT416((uint)(local_7c0._0_4_ * fVar244 * 1.9073486e-06)));
              auVar200._0_4_ = auVar72._0_4_ * fVar226;
              auVar200._4_4_ = auVar72._4_4_ * fVar226;
              auVar200._8_4_ = auVar72._8_4_ * fVar226;
              auVar200._12_4_ = auVar72._12_4_ * fVar226;
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(auVar1,auVar22);
              auVar76 = vmulps_avx512vl(auVar76,auVar200);
              auVar72 = vdpps_avx(auVar79,auVar75,0x7f);
              auVar70 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar249),auVar227);
              auVar71 = vdpps_avx(auVar69,auVar76,0x7f);
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(fVar225 + 1.0)),
                                        ZEXT416((uint)(fVar249 / fVar224)),auVar70);
              fVar224 = auVar72._0_4_ + auVar71._0_4_;
              auVar71 = vdpps_avx(local_9d0,auVar75,0x7f);
              auVar72 = vdpps_avx(auVar69,auVar79,0x7f);
              auVar70 = vmulss_avx512f(auVar77,auVar74);
              auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar70._0_4_ *
                                                             auVar74._0_4_ * auVar74._0_4_)));
              auVar70 = vdpps_avx(auVar69,local_9d0,0x7f);
              auVar75 = vfnmadd231ss_fma(auVar72,auVar73,ZEXT416((uint)fVar224));
              auVar70 = vfnmadd231ss_fma(auVar70,auVar73,auVar71);
              auVar72 = vpermilps_avx(local_860._0_16_,0xff);
              fVar251 = fVar251 - auVar72._0_4_;
              auVar74 = vshufps_avx(auVar1,auVar1,0xff);
              auVar72 = vfmsub213ss_fma(auVar75,auVar78,auVar74);
              auVar246._8_4_ = 0x80000000;
              auVar246._0_8_ = 0x8000000080000000;
              auVar246._12_4_ = 0x80000000;
              auVar248 = ZEXT1664(auVar246);
              auVar241._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar241._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar241._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar243 = ZEXT1664(auVar241);
              auVar70 = ZEXT416((uint)(auVar70._0_4_ * auVar78._0_4_));
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)),
                                        ZEXT416((uint)fVar224),auVar70);
              auVar72 = vinsertps_avx(auVar241,auVar70,0x1c);
              auVar235._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar235._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar70 = vinsertps_avx(ZEXT416((uint)fVar224),auVar235,0x10);
              auVar220._0_4_ = auVar75._0_4_;
              auVar220._4_4_ = auVar220._0_4_;
              auVar220._8_4_ = auVar220._0_4_;
              auVar220._12_4_ = auVar220._0_4_;
              auVar71 = vdivps_avx(auVar72,auVar220);
              auVar72 = vdivps_avx(auVar70,auVar220);
              auVar221._0_4_ = fVar250 * auVar71._0_4_ + fVar251 * auVar72._0_4_;
              auVar221._4_4_ = fVar250 * auVar71._4_4_ + fVar251 * auVar72._4_4_;
              auVar221._8_4_ = fVar250 * auVar71._8_4_ + fVar251 * auVar72._8_4_;
              auVar221._12_4_ = fVar250 * auVar71._12_4_ + fVar251 * auVar72._12_4_;
              auVar71 = vsubps_avx(auVar252,auVar221);
              auVar253 = ZEXT1664(auVar71);
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(auVar73,auVar23);
              if (auVar72._0_4_ < auVar76._0_4_) {
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ + auVar227._0_4_)),local_930,
                                          ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar251),auVar24);
                if (auVar73._0_4_ < auVar72._0_4_) {
                  bVar66 = uVar59 < 5;
                  fVar244 = auVar71._0_4_ + (float)local_940._0_4_;
                  if ((fVar143 <= fVar244) &&
                     (fVar249 = *(float *)(ray + k * 4 + 0x200), fVar244 <= fVar249)) {
                    auVar72 = vmovshdup_avx(auVar71);
                    bVar60 = 0;
                    if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_019e3d64;
                    auVar222._0_12_ = ZEXT812(0);
                    auVar222._12_4_ = 0;
                    auVar201._4_8_ = auVar222._4_8_;
                    auVar201._0_4_ = local_a00._0_4_;
                    auVar201._12_4_ = 0;
                    auVar72 = vrsqrt14ss_avx512f(auVar222,auVar201);
                    fVar250 = auVar72._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar60 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_019e3d64;
                      fVar250 = fVar250 * 1.5 + local_a00._0_4_ * -0.5 * fVar250 * fVar250 * fVar250
                      ;
                      auVar202._0_4_ = auVar69._0_4_ * fVar250;
                      auVar202._4_4_ = auVar69._4_4_ * fVar250;
                      auVar202._8_4_ = auVar69._8_4_ * fVar250;
                      auVar202._12_4_ = auVar69._12_4_ * fVar250;
                      auVar227 = vfmadd213ps_fma(auVar74,auVar202,auVar1);
                      auVar72 = vshufps_avx(auVar202,auVar202,0xc9);
                      auVar73 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar203._0_4_ = auVar202._0_4_ * auVar73._0_4_;
                      auVar203._4_4_ = auVar202._4_4_ * auVar73._4_4_;
                      auVar203._8_4_ = auVar202._8_4_ * auVar73._8_4_;
                      auVar203._12_4_ = auVar202._12_4_ * auVar73._12_4_;
                      auVar70 = vfmsub231ps_fma(auVar203,auVar1,auVar72);
                      auVar72 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar73 = vshufps_avx(auVar227,auVar227,0xc9);
                      auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                      auVar152._0_4_ = auVar227._0_4_ * auVar70._0_4_;
                      auVar152._4_4_ = auVar227._4_4_ * auVar70._4_4_;
                      auVar152._8_4_ = auVar227._8_4_ * auVar70._8_4_;
                      auVar152._12_4_ = auVar227._12_4_ * auVar70._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar152,auVar72,auVar73);
                      auVar161 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar161,auVar253);
                      auVar161 = vpermps_avx512f(auVar161,ZEXT1664(auVar72));
                      auVar265 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar265,ZEXT1664(auVar72));
                      local_380 = vbroadcastss_avx512f(auVar72);
                      local_400[0] = (RTCHitN)auVar161[0];
                      local_400[1] = (RTCHitN)auVar161[1];
                      local_400[2] = (RTCHitN)auVar161[2];
                      local_400[3] = (RTCHitN)auVar161[3];
                      local_400[4] = (RTCHitN)auVar161[4];
                      local_400[5] = (RTCHitN)auVar161[5];
                      local_400[6] = (RTCHitN)auVar161[6];
                      local_400[7] = (RTCHitN)auVar161[7];
                      local_400[8] = (RTCHitN)auVar161[8];
                      local_400[9] = (RTCHitN)auVar161[9];
                      local_400[10] = (RTCHitN)auVar161[10];
                      local_400[0xb] = (RTCHitN)auVar161[0xb];
                      local_400[0xc] = (RTCHitN)auVar161[0xc];
                      local_400[0xd] = (RTCHitN)auVar161[0xd];
                      local_400[0xe] = (RTCHitN)auVar161[0xe];
                      local_400[0xf] = (RTCHitN)auVar161[0xf];
                      local_400[0x10] = (RTCHitN)auVar161[0x10];
                      local_400[0x11] = (RTCHitN)auVar161[0x11];
                      local_400[0x12] = (RTCHitN)auVar161[0x12];
                      local_400[0x13] = (RTCHitN)auVar161[0x13];
                      local_400[0x14] = (RTCHitN)auVar161[0x14];
                      local_400[0x15] = (RTCHitN)auVar161[0x15];
                      local_400[0x16] = (RTCHitN)auVar161[0x16];
                      local_400[0x17] = (RTCHitN)auVar161[0x17];
                      local_400[0x18] = (RTCHitN)auVar161[0x18];
                      local_400[0x19] = (RTCHitN)auVar161[0x19];
                      local_400[0x1a] = (RTCHitN)auVar161[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar161[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar161[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar161[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar161[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar161[0x1f];
                      local_400[0x20] = (RTCHitN)auVar161[0x20];
                      local_400[0x21] = (RTCHitN)auVar161[0x21];
                      local_400[0x22] = (RTCHitN)auVar161[0x22];
                      local_400[0x23] = (RTCHitN)auVar161[0x23];
                      local_400[0x24] = (RTCHitN)auVar161[0x24];
                      local_400[0x25] = (RTCHitN)auVar161[0x25];
                      local_400[0x26] = (RTCHitN)auVar161[0x26];
                      local_400[0x27] = (RTCHitN)auVar161[0x27];
                      local_400[0x28] = (RTCHitN)auVar161[0x28];
                      local_400[0x29] = (RTCHitN)auVar161[0x29];
                      local_400[0x2a] = (RTCHitN)auVar161[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar161[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar161[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar161[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar161[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar161[0x2f];
                      local_400[0x30] = (RTCHitN)auVar161[0x30];
                      local_400[0x31] = (RTCHitN)auVar161[0x31];
                      local_400[0x32] = (RTCHitN)auVar161[0x32];
                      local_400[0x33] = (RTCHitN)auVar161[0x33];
                      local_400[0x34] = (RTCHitN)auVar161[0x34];
                      local_400[0x35] = (RTCHitN)auVar161[0x35];
                      local_400[0x36] = (RTCHitN)auVar161[0x36];
                      local_400[0x37] = (RTCHitN)auVar161[0x37];
                      local_400[0x38] = (RTCHitN)auVar161[0x38];
                      local_400[0x39] = (RTCHitN)auVar161[0x39];
                      local_400[0x3a] = (RTCHitN)auVar161[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar161[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar161[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar161[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar161[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar161[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar161 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar161);
                      vpcmpeqd_avx2(auVar161._0_32_,auVar161._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar244;
                      auVar161 = vmovdqa64_avx512f(local_500);
                      local_780 = vmovdqa64_avx512f(auVar161);
                      local_a30.valid = (int *)local_780;
                      local_a30.geometryUserPtr = pGVar3->userPtr;
                      local_a30.context = context->user;
                      local_a30.hit = local_400;
                      local_a30.N = 0x10;
                      local_a30.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar243 = ZEXT1664(auVar241);
                        auVar248 = ZEXT1664(auVar246);
                        auVar253 = ZEXT1664(auVar71);
                        auVar255 = ZEXT1664(auVar69);
                        auVar257 = ZEXT1664(local_a00._0_16_);
                        auVar262 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_a30);
                        auVar161 = vmovdqa64_avx512f(local_780);
                      }
                      uVar15 = vptestmd_avx512f(auVar161,auVar161);
                      if ((short)uVar15 != 0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar243 = ZEXT1664(auVar243._0_16_);
                          auVar248 = ZEXT1664(auVar248._0_16_);
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          auVar255 = ZEXT1664(auVar255._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          (*p_Var4)(&local_a30);
                          auVar161 = vmovdqa64_avx512f(local_780);
                        }
                        uVar67 = vptestmd_avx512f(auVar161,auVar161);
                        auVar161 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar67 & 1);
                        auVar265._0_4_ =
                             (uint)bVar5 * auVar161._0_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x200);
                        bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
                        auVar265._4_4_ =
                             (uint)bVar5 * auVar161._4_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x204);
                        bVar5 = (bool)((byte)(uVar67 >> 2) & 1);
                        auVar265._8_4_ =
                             (uint)bVar5 * auVar161._8_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x208);
                        bVar5 = (bool)((byte)(uVar67 >> 3) & 1);
                        auVar265._12_4_ =
                             (uint)bVar5 * auVar161._12_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x20c);
                        bVar5 = (bool)((byte)(uVar67 >> 4) & 1);
                        auVar265._16_4_ =
                             (uint)bVar5 * auVar161._16_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x210);
                        bVar5 = (bool)((byte)(uVar67 >> 5) & 1);
                        auVar265._20_4_ =
                             (uint)bVar5 * auVar161._20_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x214);
                        bVar5 = (bool)((byte)(uVar67 >> 6) & 1);
                        auVar265._24_4_ =
                             (uint)bVar5 * auVar161._24_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x218);
                        bVar5 = (bool)((byte)(uVar67 >> 7) & 1);
                        auVar265._28_4_ =
                             (uint)bVar5 * auVar161._28_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x21c);
                        bVar5 = (bool)((byte)(uVar67 >> 8) & 1);
                        auVar265._32_4_ =
                             (uint)bVar5 * auVar161._32_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x220);
                        bVar5 = (bool)((byte)(uVar67 >> 9) & 1);
                        auVar265._36_4_ =
                             (uint)bVar5 * auVar161._36_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x224);
                        bVar5 = (bool)((byte)(uVar67 >> 10) & 1);
                        auVar265._40_4_ =
                             (uint)bVar5 * auVar161._40_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x228);
                        bVar5 = (bool)((byte)(uVar67 >> 0xb) & 1);
                        auVar265._44_4_ =
                             (uint)bVar5 * auVar161._44_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x22c);
                        bVar5 = (bool)((byte)(uVar67 >> 0xc) & 1);
                        auVar265._48_4_ =
                             (uint)bVar5 * auVar161._48_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x230);
                        bVar5 = (bool)((byte)(uVar67 >> 0xd) & 1);
                        auVar265._52_4_ =
                             (uint)bVar5 * auVar161._52_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x234);
                        bVar5 = (bool)((byte)(uVar67 >> 0xe) & 1);
                        auVar265._56_4_ =
                             (uint)bVar5 * auVar161._56_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x238);
                        bVar5 = SUB81(uVar67 >> 0xf,0);
                        auVar265._60_4_ =
                             (uint)bVar5 * auVar161._60_4_ |
                             (uint)!bVar5 * *(int *)(local_a30.ray + 0x23c);
                        *(undefined1 (*) [64])(local_a30.ray + 0x200) = auVar265;
                        bVar60 = 1;
                        if ((short)uVar67 != 0) goto LAB_019e3d64;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar249;
                    }
                  }
                  bVar60 = 0;
                  goto LAB_019e3d64;
                }
              }
              uVar59 = uVar59 + 1;
            }
            bVar66 = false;
LAB_019e3d64:
            bVar65 = bVar65 | bVar66 & bVar60;
            uVar168 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar237._4_4_ = uVar168;
            auVar237._0_4_ = uVar168;
            auVar237._8_4_ = uVar168;
            auVar237._12_4_ = uVar168;
            auVar237._16_4_ = uVar168;
            auVar237._20_4_ = uVar168;
            auVar237._24_4_ = uVar168;
            auVar237._28_4_ = uVar168;
            auVar161 = ZEXT3264(auVar237);
            auVar51._4_4_ = fStack_6fc;
            auVar51._0_4_ = local_700;
            auVar51._8_4_ = fStack_6f8;
            auVar51._12_4_ = fStack_6f4;
            auVar51._16_4_ = fStack_6f0;
            auVar51._20_4_ = fStack_6ec;
            auVar51._24_4_ = fStack_6e8;
            auVar51._28_4_ = fStack_6e4;
            uVar15 = vcmpps_avx512vl(auVar237,auVar51,0xd);
          }
          uVar17 = vpcmpd_avx512vl(local_6c0,local_660,1);
          uVar16 = vpcmpd_avx512vl(local_6c0,_local_720,1);
          auVar181._0_4_ = (float)local_7e0._0_4_ + (float)local_440._0_4_;
          auVar181._4_4_ = (float)local_7e0._4_4_ + (float)local_440._4_4_;
          auVar181._8_4_ = fStack_7d8 + fStack_438;
          auVar181._12_4_ = fStack_7d4 + fStack_434;
          auVar181._16_4_ = fStack_7d0 + fStack_430;
          auVar181._20_4_ = fStack_7cc + fStack_42c;
          auVar181._24_4_ = fStack_7c8 + fStack_428;
          auVar181._28_4_ = fStack_7c4 + fStack_424;
          uVar168 = auVar161._0_4_;
          auVar205._4_4_ = uVar168;
          auVar205._0_4_ = uVar168;
          auVar205._8_4_ = uVar168;
          auVar205._12_4_ = uVar168;
          auVar205._16_4_ = uVar168;
          auVar205._20_4_ = uVar168;
          auVar205._24_4_ = uVar168;
          auVar205._28_4_ = uVar168;
          uVar15 = vcmpps_avx512vl(auVar181,auVar205,2);
          bVar58 = bVar58 & (byte)uVar17 & (byte)uVar15;
          auVar223._0_4_ = (float)local_7e0._0_4_ + (float)local_6a0._0_4_;
          auVar223._4_4_ = (float)local_7e0._4_4_ + (float)local_6a0._4_4_;
          auVar223._8_4_ = fStack_7d8 + fStack_698;
          auVar223._12_4_ = fStack_7d4 + fStack_694;
          auVar223._16_4_ = fStack_7d0 + fStack_690;
          auVar223._20_4_ = fStack_7cc + fStack_68c;
          auVar223._24_4_ = fStack_7c8 + fStack_688;
          auVar223._28_4_ = fStack_7c4 + fStack_684;
          uVar15 = vcmpps_avx512vl(auVar223,auVar205,2);
          bVar53 = bVar53 & (byte)uVar16 & (byte)uVar15 | bVar58;
          if (bVar53 != 0) {
            abStack_1a0[uVar57 * 0x60] = bVar53;
            bVar66 = (bool)(bVar58 >> 1 & 1);
            bVar5 = (bool)(bVar58 >> 2 & 1);
            bVar6 = (bool)(bVar58 >> 3 & 1);
            bVar7 = (bool)(bVar58 >> 4 & 1);
            bVar8 = (bool)(bVar58 >> 5 & 1);
            auStack_180[uVar57 * 0x18] =
                 (uint)(bVar58 & 1) * local_440._0_4_ | (uint)!(bool)(bVar58 & 1) * local_6a0._0_4_;
            auStack_180[uVar57 * 0x18 + 1] =
                 (uint)bVar66 * local_440._4_4_ | (uint)!bVar66 * local_6a0._4_4_;
            auStack_180[uVar57 * 0x18 + 2] =
                 (uint)bVar5 * (int)fStack_438 | (uint)!bVar5 * (int)fStack_698;
            auStack_180[uVar57 * 0x18 + 3] =
                 (uint)bVar6 * (int)fStack_434 | (uint)!bVar6 * (int)fStack_694;
            auStack_180[uVar57 * 0x18 + 4] =
                 (uint)bVar7 * (int)fStack_430 | (uint)!bVar7 * (int)fStack_690;
            auStack_180[uVar57 * 0x18 + 5] =
                 (uint)bVar8 * (int)fStack_42c | (uint)!bVar8 * (int)fStack_68c;
            auStack_180[uVar57 * 0x18 + 6] =
                 (uint)(bVar58 >> 6) * (int)fStack_428 |
                 (uint)!(bool)(bVar58 >> 6) * (int)fStack_688;
            (&fStack_164)[uVar57 * 0x18] = fStack_684;
            uVar67 = vmovlps_avx(local_6d0);
            (&uStack_160)[uVar57 * 0xc] = uVar67;
            aiStack_158[uVar57 * 0x18] = iVar64 + 1;
            uVar57 = (ulong)((int)uVar57 + 1);
          }
          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar265 = ZEXT3264(auVar80);
          auVar161 = ZEXT3264(_DAT_01f7b040);
        }
      }
    }
    do {
      uVar68 = (uint)uVar57;
      uVar57 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        if (bVar65 != 0) goto LAB_019e43a1;
        uVar168 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar31._4_4_ = uVar168;
        auVar31._0_4_ = uVar168;
        auVar31._8_4_ = uVar168;
        auVar31._12_4_ = uVar168;
        auVar31._16_4_ = uVar168;
        auVar31._20_4_ = uVar168;
        auVar31._24_4_ = uVar168;
        auVar31._28_4_ = uVar168;
        uVar15 = vcmpps_avx512vl(local_640,auVar31,2);
        uVar62 = (ulong)((uint)uVar61 & (uint)uVar15);
        goto LAB_019e1954;
      }
      auVar80 = *(undefined1 (*) [32])(auStack_180 + uVar57 * 0x18);
      auVar182._0_4_ = auVar80._0_4_ + (float)local_7e0._0_4_;
      auVar182._4_4_ = auVar80._4_4_ + (float)local_7e0._4_4_;
      auVar182._8_4_ = auVar80._8_4_ + fStack_7d8;
      auVar182._12_4_ = auVar80._12_4_ + fStack_7d4;
      auVar182._16_4_ = auVar80._16_4_ + fStack_7d0;
      auVar182._20_4_ = auVar80._20_4_ + fStack_7cc;
      auVar182._24_4_ = auVar80._24_4_ + fStack_7c8;
      auVar182._28_4_ = auVar80._28_4_ + fStack_7c4;
      uVar168 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar30._4_4_ = uVar168;
      auVar30._0_4_ = uVar168;
      auVar30._8_4_ = uVar168;
      auVar30._12_4_ = uVar168;
      auVar30._16_4_ = uVar168;
      auVar30._20_4_ = uVar168;
      auVar30._24_4_ = uVar168;
      auVar30._28_4_ = uVar168;
      uVar15 = vcmpps_avx512vl(auVar182,auVar30,2);
      uVar136 = (uint)uVar15 & (uint)abStack_1a0[uVar57 * 0x60];
    } while (uVar136 == 0);
    uVar67 = (&uStack_160)[uVar57 * 0xc];
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar67;
    auVar206._8_4_ = 0x7f800000;
    auVar206._0_8_ = 0x7f8000007f800000;
    auVar206._12_4_ = 0x7f800000;
    auVar206._16_4_ = 0x7f800000;
    auVar206._20_4_ = 0x7f800000;
    auVar206._24_4_ = 0x7f800000;
    auVar206._28_4_ = 0x7f800000;
    auVar81 = vblendmps_avx512vl(auVar206,auVar80);
    bVar53 = (byte)uVar136;
    auVar134._0_4_ =
         (uint)(bVar53 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)auVar80._0_4_;
    bVar66 = (bool)((byte)(uVar136 >> 1) & 1);
    auVar134._4_4_ = (uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * (int)auVar80._4_4_;
    bVar66 = (bool)((byte)(uVar136 >> 2) & 1);
    auVar134._8_4_ = (uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * (int)auVar80._8_4_;
    bVar66 = (bool)((byte)(uVar136 >> 3) & 1);
    auVar134._12_4_ = (uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * (int)auVar80._12_4_;
    bVar66 = (bool)((byte)(uVar136 >> 4) & 1);
    auVar134._16_4_ = (uint)bVar66 * auVar81._16_4_ | (uint)!bVar66 * (int)auVar80._16_4_;
    bVar66 = (bool)((byte)(uVar136 >> 5) & 1);
    auVar134._20_4_ = (uint)bVar66 * auVar81._20_4_ | (uint)!bVar66 * (int)auVar80._20_4_;
    bVar66 = (bool)((byte)(uVar136 >> 6) & 1);
    auVar134._24_4_ = (uint)bVar66 * auVar81._24_4_ | (uint)!bVar66 * (int)auVar80._24_4_;
    auVar134._28_4_ =
         (uVar136 >> 7) * auVar81._28_4_ | (uint)!SUB41(uVar136 >> 7,0) * (int)auVar80._28_4_;
    auVar80 = vshufps_avx(auVar134,auVar134,0xb1);
    auVar80 = vminps_avx(auVar134,auVar80);
    auVar81 = vshufpd_avx(auVar80,auVar80,5);
    auVar80 = vminps_avx(auVar80,auVar81);
    auVar81 = vpermpd_avx2(auVar80,0x4e);
    auVar80 = vminps_avx(auVar80,auVar81);
    uVar15 = vcmpps_avx512vl(auVar134,auVar80,0);
    bVar63 = (byte)uVar15 & bVar53;
    if (bVar63 != 0) {
      uVar136 = (uint)bVar63;
    }
    uVar137 = 0;
    for (; (uVar136 & 1) == 0; uVar136 = uVar136 >> 1 | 0x80000000) {
      uVar137 = uVar137 + 1;
    }
    iVar64 = aiStack_158[uVar57 * 0x18];
    bVar53 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar53;
    abStack_1a0[uVar57 * 0x60] = bVar53;
    if (bVar53 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar168 = (undefined4)uVar67;
    auVar160._4_4_ = uVar168;
    auVar160._0_4_ = uVar168;
    auVar160._8_4_ = uVar168;
    auVar160._12_4_ = uVar168;
    auVar160._16_4_ = uVar168;
    auVar160._20_4_ = uVar168;
    auVar160._24_4_ = uVar168;
    auVar160._28_4_ = uVar168;
    auVar71 = vmovshdup_avx(auVar179);
    auVar71 = vsubps_avx(auVar71,auVar179);
    auVar183._0_4_ = auVar71._0_4_;
    auVar183._4_4_ = auVar183._0_4_;
    auVar183._8_4_ = auVar183._0_4_;
    auVar183._12_4_ = auVar183._0_4_;
    auVar183._16_4_ = auVar183._0_4_;
    auVar183._20_4_ = auVar183._0_4_;
    auVar183._24_4_ = auVar183._0_4_;
    auVar183._28_4_ = auVar183._0_4_;
    auVar71 = vfmadd132ps_fma(auVar183,auVar160,auVar161._0_32_);
    auVar80 = ZEXT1632(auVar71);
    local_400[0] = (RTCHitN)auVar80[0];
    local_400[1] = (RTCHitN)auVar80[1];
    local_400[2] = (RTCHitN)auVar80[2];
    local_400[3] = (RTCHitN)auVar80[3];
    local_400[4] = (RTCHitN)auVar80[4];
    local_400[5] = (RTCHitN)auVar80[5];
    local_400[6] = (RTCHitN)auVar80[6];
    local_400[7] = (RTCHitN)auVar80[7];
    local_400[8] = (RTCHitN)auVar80[8];
    local_400[9] = (RTCHitN)auVar80[9];
    local_400[10] = (RTCHitN)auVar80[10];
    local_400[0xb] = (RTCHitN)auVar80[0xb];
    local_400[0xc] = (RTCHitN)auVar80[0xc];
    local_400[0xd] = (RTCHitN)auVar80[0xd];
    local_400[0xe] = (RTCHitN)auVar80[0xe];
    local_400[0xf] = (RTCHitN)auVar80[0xf];
    local_400[0x10] = (RTCHitN)auVar80[0x10];
    local_400[0x11] = (RTCHitN)auVar80[0x11];
    local_400[0x12] = (RTCHitN)auVar80[0x12];
    local_400[0x13] = (RTCHitN)auVar80[0x13];
    local_400[0x14] = (RTCHitN)auVar80[0x14];
    local_400[0x15] = (RTCHitN)auVar80[0x15];
    local_400[0x16] = (RTCHitN)auVar80[0x16];
    local_400[0x17] = (RTCHitN)auVar80[0x17];
    local_400[0x18] = (RTCHitN)auVar80[0x18];
    local_400[0x19] = (RTCHitN)auVar80[0x19];
    local_400[0x1a] = (RTCHitN)auVar80[0x1a];
    local_400[0x1b] = (RTCHitN)auVar80[0x1b];
    local_400[0x1c] = (RTCHitN)auVar80[0x1c];
    local_400[0x1d] = (RTCHitN)auVar80[0x1d];
    local_400[0x1e] = (RTCHitN)auVar80[0x1e];
    local_400[0x1f] = (RTCHitN)auVar80[0x1f];
    local_6d0._8_8_ = 0;
    local_6d0._0_8_ = *(ulong *)(local_400 + (ulong)uVar137 * 4);
    uVar57 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }